

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  uchar uVar3;
  short sVar4;
  stbi__uint32 b;
  int iVar5;
  stbi_uc asVar6 [4];
  stbi_uc asVar7 [4];
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  byte bVar31;
  short sVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  stbi_uc sVar39;
  byte bVar40;
  int iVar41;
  stbi__uint32 sVar42;
  int iVar43;
  stbi__jpeg *psVar44;
  byte *pbVar45;
  byte *pbVar46;
  stbi__context *psVar47;
  uchar *data_00;
  float *data_01;
  stbi_uc *psVar48;
  void *pvVar49;
  code *pcVar50;
  stbi__context *psVar51;
  uchar *puVar52;
  uint uVar53;
  stbi_uc *psVar54;
  long lVar55;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  int why;
  uint uVar56;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *paVar57;
  ulong extraout_RDX_02;
  long lVar58;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  int iVar59;
  ulong uVar60;
  stbi_uc *psVar61;
  stbi_uc *psVar62;
  int iVar63;
  ulong uVar64;
  stbi__uint32 sVar65;
  uint uVar66;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  int iVar67;
  int iVar68;
  short sVar69;
  int *piVar70;
  int iVar71;
  ulong uVar72;
  ulong uVar73;
  uint uVar74;
  uint uVar75;
  short *psVar76;
  stbi_uc (*pasVar77) [4];
  bool bVar78;
  undefined1 auVar79 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  stbi_uc *coutput [4];
  short data [64];
  ulong local_89a8;
  uint local_8980;
  int local_8974;
  uint local_8930;
  int local_892c;
  stbi__bmp_data local_8928;
  anon_struct_96_18_0d0905d3 *local_8900;
  undefined4 local_88f8;
  int local_88f4;
  long local_88f0;
  int local_88e4;
  int local_88e0;
  int local_88dc;
  int local_88d8;
  int local_88d4;
  int local_88d0;
  int local_88cc;
  ulong local_88c8;
  ulong local_88c0;
  ulong local_88b8;
  ulong local_88b0;
  stbi__gif local_88a8;
  
  psVar62 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  psVar44 = (stbi__jpeg *)malloc(0x4888);
  psVar44->s = s;
  psVar44->idct_block_kernel = stbi__idct_simd;
  psVar44->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar44->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar44->jfif = 0;
  psVar44->app14_color_transform = -1;
  psVar44->marker = 0xff;
  sVar39 = stbi__get_marker(psVar44);
  if (sVar39 != 0xd8) {
    stbi__g_failure_reason = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar44);
  if (sVar39 == 0xd8) {
    psVar44 = (stbi__jpeg *)malloc(0x4888);
    psVar44->s = s;
    psVar44->idct_block_kernel = stbi__idct_simd;
    psVar44->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar44->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      psVar44->img_comp[0].raw_data = (void *)0x0;
      psVar44->img_comp[0].raw_coeff = (void *)0x0;
      psVar44->img_comp[1].raw_data = (void *)0x0;
      psVar44->img_comp[1].raw_coeff = (void *)0x0;
      psVar44->img_comp[2].raw_data = (void *)0x0;
      psVar44->img_comp[2].raw_coeff = (void *)0x0;
      psVar44->img_comp[3].raw_data = (void *)0x0;
      psVar44->img_comp[3].raw_coeff = (void *)0x0;
      psVar44->restart_interval = 0;
      iVar41 = stbi__decode_jpeg_header(psVar44,0);
      uVar74 = extraout_EDX;
      if (iVar41 != 0) {
        paVar1 = psVar44->img_comp;
        bVar40 = stbi__get_marker(psVar44);
LAB_0010c5fd:
        if (bVar40 == 0xda) {
          iVar41 = stbi__get16be(psVar44->s);
          psVar51 = psVar44->s;
          pbVar46 = psVar51->img_buffer;
          paVar57 = extraout_RDX_00;
          if (psVar51->img_buffer_end <= pbVar46) {
            if (psVar51->read_from_callbacks != 0) {
              psVar62 = psVar51->buffer_start;
              iVar59 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar62,psVar51->buflen);
              if (iVar59 == 0) {
                psVar51->read_from_callbacks = 0;
                psVar61 = psVar51->buffer_start + 1;
                psVar51->buffer_start[0] = '\0';
                bVar40 = 0;
              }
              else {
                psVar61 = psVar62 + iVar59;
                bVar40 = *psVar62;
              }
              psVar51->img_buffer_end = psVar61;
              psVar51->img_buffer = psVar51->buffer_start + 1;
              paVar57 = extraout_RDX_01;
              goto LAB_0010c6ec;
            }
            psVar44->scan_n = 0;
LAB_0010e0e1:
            stbi__g_failure_reason = "bad SOS component count";
            goto LAB_0010e0e8;
          }
          psVar51->img_buffer = pbVar46 + 1;
          bVar40 = *pbVar46;
LAB_0010c6ec:
          uVar74 = (uint)bVar40;
          psVar44->scan_n = uVar74;
          if (((byte)(bVar40 - 5) < 0xfc) || (psVar51 = psVar44->s, psVar51->img_n < (int)uVar74))
          goto LAB_0010e0e1;
          if (iVar41 != uVar74 * 2 + 6) {
            stbi__g_failure_reason = "bad SOS len";
            goto LAB_0010e0e8;
          }
          lVar58 = 0;
          do {
            pbVar45 = psVar51->img_buffer;
            pbVar46 = psVar51->img_buffer_end;
            if (pbVar45 < pbVar46) {
              psVar51->img_buffer = pbVar45 + 1;
              uVar53 = (uint)*pbVar45;
              pbVar45 = pbVar45 + 1;
            }
            else if (psVar51->read_from_callbacks == 0) {
              uVar53 = 0;
            }
            else {
              psVar62 = psVar51->buffer_start;
              iVar41 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar62,psVar51->buflen);
              if (iVar41 == 0) {
                psVar51->read_from_callbacks = 0;
                psVar61 = psVar51->buffer_start + 1;
                psVar51->buffer_start[0] = '\0';
                uVar53 = 0;
              }
              else {
                psVar61 = psVar62 + iVar41;
                uVar53 = (uint)*psVar62;
              }
              psVar51->img_buffer_end = psVar61;
              psVar51->img_buffer = psVar51->buffer_start + 1;
              psVar51 = psVar44->s;
              pbVar45 = psVar51->img_buffer;
              pbVar46 = psVar51->img_buffer_end;
            }
            if (pbVar45 < pbVar46) {
              psVar51->img_buffer = pbVar45 + 1;
              uVar66 = (uint)*pbVar45;
            }
            else if (psVar51->read_from_callbacks == 0) {
              uVar66 = 0;
            }
            else {
              psVar62 = psVar51->buffer_start;
              iVar41 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar62,psVar51->buflen);
              if (iVar41 == 0) {
                psVar51->read_from_callbacks = 0;
                psVar61 = psVar51->buffer_start + 1;
                psVar51->buffer_start[0] = '\0';
                uVar66 = 0;
              }
              else {
                psVar61 = psVar62 + iVar41;
                uVar66 = (uint)*psVar62;
              }
              psVar51->img_buffer_end = psVar61;
              psVar51->img_buffer = psVar51->buffer_start + 1;
              psVar51 = psVar44->s;
            }
            uVar74 = psVar51->img_n;
            if ((long)(int)uVar74 < 1) {
              uVar64 = 0;
            }
            else {
              uVar64 = 0;
              paVar57 = paVar1;
              while (paVar57->id != uVar53) {
                uVar64 = uVar64 + 1;
                paVar57 = paVar57 + 1;
                if ((long)(int)uVar74 == uVar64) goto LAB_0010e0ef;
              }
            }
            if ((uint)uVar64 == uVar74) goto LAB_0010e0ef;
            uVar73 = uVar64 & 0xffffffff;
            paVar57 = (anon_struct_96_18_0d0905d3 *)(uVar73 * 0x60);
            psVar44->img_comp[uVar73].hd = uVar66 >> 4;
            if (0x3f < (byte)uVar66) {
              stbi__g_failure_reason = "bad DC huff";
              goto LAB_0010e0e8;
            }
            paVar57 = paVar1 + uVar73;
            paVar57->ha = uVar66 & 0xf;
            if (3 < (uVar66 & 0xf)) {
              stbi__g_failure_reason = "bad AC huff";
              goto LAB_0010e0e8;
            }
            psVar44->order[lVar58] = (uint)uVar64;
            lVar58 = lVar58 + 1;
          } while (lVar58 < psVar44->scan_n);
          pbVar46 = psVar51->img_buffer;
          pbVar45 = psVar51->img_buffer_end;
          if (pbVar46 < pbVar45) {
            psVar51->img_buffer = pbVar46 + 1;
            bVar40 = *pbVar46;
            pbVar46 = pbVar46 + 1;
          }
          else if (psVar51->read_from_callbacks == 0) {
            bVar40 = 0;
          }
          else {
            psVar62 = psVar51->buffer_start;
            iVar41 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar62,psVar51->buflen);
            if (iVar41 == 0) {
              psVar51->read_from_callbacks = 0;
              psVar61 = psVar51->buffer_start + 1;
              psVar51->buffer_start[0] = '\0';
              bVar40 = 0;
            }
            else {
              psVar61 = psVar62 + iVar41;
              bVar40 = *psVar62;
            }
            psVar51->img_buffer_end = psVar61;
            psVar51->img_buffer = psVar51->buffer_start + 1;
            psVar51 = psVar44->s;
            pbVar46 = psVar51->img_buffer;
            pbVar45 = psVar51->img_buffer_end;
          }
          psVar44->spec_start = (uint)bVar40;
          if (pbVar46 < pbVar45) {
            psVar51->img_buffer = pbVar46 + 1;
            uVar74 = (uint)*pbVar46;
            pbVar46 = pbVar46 + 1;
          }
          else if (psVar51->read_from_callbacks == 0) {
            uVar74 = 0;
          }
          else {
            psVar62 = psVar51->buffer_start;
            iVar41 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar62,psVar51->buflen);
            if (iVar41 == 0) {
              psVar51->read_from_callbacks = 0;
              psVar61 = psVar51->buffer_start + 1;
              psVar51->buffer_start[0] = '\0';
              uVar74 = 0;
            }
            else {
              psVar61 = psVar62 + iVar41;
              uVar74 = (uint)*psVar62;
            }
            psVar51->img_buffer_end = psVar61;
            psVar51->img_buffer = psVar51->buffer_start + 1;
            psVar51 = psVar44->s;
            pbVar46 = psVar51->img_buffer;
            pbVar45 = psVar51->img_buffer_end;
          }
          psVar44->spec_end = uVar74;
          if (pbVar46 < pbVar45) {
            psVar51->img_buffer = pbVar46 + 1;
            uVar74 = (uint)*pbVar46;
          }
          else if (psVar51->read_from_callbacks == 0) {
            uVar74 = 0;
          }
          else {
            psVar62 = psVar51->buffer_start;
            iVar41 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar62,psVar51->buflen);
            if (iVar41 == 0) {
              psVar51->read_from_callbacks = 0;
              psVar61 = psVar51->buffer_start + 1;
              psVar51->buffer_start[0] = '\0';
              uVar74 = 0;
            }
            else {
              psVar61 = psVar62 + iVar41;
              uVar74 = (uint)*psVar62;
            }
            psVar51->img_buffer_end = psVar61;
            psVar51->img_buffer = psVar51->buffer_start + 1;
          }
          psVar44->succ_high = uVar74 >> 4;
          uVar53 = uVar74 & 0xf;
          paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar53;
          psVar44->succ_low = uVar53;
          iVar41 = psVar44->progressive;
          iVar59 = psVar44->spec_start;
          if (iVar41 == 0) {
            if ((iVar59 != 0) || ((0xf < (byte)uVar74 || (uVar53 != 0)))) {
LAB_0010eb72:
              stbi__g_failure_reason = "bad SOS";
              goto LAB_0010e0e8;
            }
            psVar44->spec_end = 0x3f;
          }
          else if ((((0x3f < iVar59) || (0x3f < psVar44->spec_end)) || (psVar44->spec_end < iVar59))
                  || ((0xdf < (byte)uVar74 || (0xd < uVar53)))) goto LAB_0010eb72;
          uVar74 = psVar44->scan_n;
          uVar64 = (ulong)uVar74;
          iVar59 = psVar44->restart_interval;
          if (iVar59 == 0) {
            iVar59 = 0x7fffffff;
          }
          psVar44->code_buffer = 0;
          psVar44->code_bits = 0;
          psVar44->nomore = 0;
          psVar44->img_comp[3].dc_pred = 0;
          psVar44->img_comp[2].dc_pred = 0;
          psVar44->img_comp[1].dc_pred = 0;
          psVar44->img_comp[0].dc_pred = 0;
          psVar44->marker = 0xff;
          psVar44->todo = iVar59;
          psVar44->eob_run = 0;
          if (iVar41 == 0) {
            if (uVar74 == 1) {
              iVar41 = psVar44->order[0];
              iVar59 = psVar44->img_comp[iVar41].y + 7 >> 3;
              bVar78 = true;
              uVar74 = 1;
              if (0 < iVar59) {
                uVar53 = paVar1[iVar41].x + 7 >> 3;
                iVar68 = 0;
                iVar67 = 0;
                do {
                  if (0 < (int)uVar53) {
                    lVar58 = 0;
                    do {
                      iVar63 = stbi__jpeg_decode_block
                                         (psVar44,(short *)&local_88a8,
                                          (stbi__huffman *)psVar44->huff_dc[paVar1[iVar41].hd].fast,
                                          (stbi__huffman *)psVar44->huff_ac[paVar1[iVar41].ha].fast,
                                          psVar44->fast_ac[paVar1[iVar41].ha],iVar41,
                                          psVar44->dequant[paVar1[iVar41].tq]);
                      uVar74 = extraout_EDX_02;
                      if (iVar63 == 0) goto LAB_0010d811;
                      (*psVar44->idct_block_kernel)
                                (paVar1[iVar41].data + lVar58 + iVar68 * paVar1[iVar41].w2,
                                 paVar1[iVar41].w2,(short *)&local_88a8);
                      uVar74 = (uint)extraout_RDX_02;
                      iVar63 = psVar44->todo;
                      psVar44->todo = iVar63 + -1;
                      uVar64 = extraout_RDX_02;
                      if (iVar63 < 2) {
                        if (psVar44->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar44);
                          uVar74 = extraout_EDX_03;
                        }
                        if ((psVar44->marker & 0xf8) != 0xd0) goto LAB_0010d80a;
                        psVar44->code_buffer = 0;
                        psVar44->code_bits = 0;
                        psVar44->nomore = 0;
                        psVar44->img_comp[3].dc_pred = 0;
                        psVar44->img_comp[2].dc_pred = 0;
                        psVar44->img_comp[1].dc_pred = 0;
                        psVar44->img_comp[0].dc_pred = 0;
                        psVar44->marker = 0xff;
                        iVar63 = psVar44->restart_interval;
                        uVar64 = 0x7fffffff;
                        if (iVar63 == 0) {
                          iVar63 = 0x7fffffff;
                        }
                        psVar44->todo = iVar63;
                        psVar44->eob_run = 0;
                      }
                      lVar58 = lVar58 + 8;
                    } while ((ulong)uVar53 * 8 != lVar58);
                  }
                  uVar74 = (uint)uVar64;
                  iVar67 = iVar67 + 1;
                  iVar68 = iVar68 + 8;
                } while (iVar67 != iVar59);
LAB_0010d80a:
                bVar78 = true;
              }
            }
            else {
              uVar74 = psVar44->img_mcu_y;
              uVar64 = (ulong)uVar74;
              bVar78 = true;
              if (0 < (int)uVar74) {
                iVar41 = psVar44->img_mcu_x;
                iVar67 = 0;
                do {
                  if (0 < iVar41) {
                    uVar53 = 0;
                    do {
                      iVar41 = psVar44->scan_n;
                      if (0 < iVar41) {
                        uVar64 = 0;
                        do {
                          iVar59 = psVar44->order[uVar64];
                          iVar68 = psVar44->img_comp[iVar59].v;
                          if (0 < iVar68) {
                            iVar41 = paVar1[iVar59].h;
                            iVar63 = 0;
                            do {
                              if (0 < iVar41) {
                                iVar68 = 0;
                                do {
                                  iVar71 = paVar1[iVar59].v;
                                  iVar43 = stbi__jpeg_decode_block
                                                     (psVar44,(short *)&local_88a8,
                                                      (stbi__huffman *)
                                                      psVar44->huff_dc[paVar1[iVar59].hd].fast,
                                                      (stbi__huffman *)
                                                      psVar44->huff_ac[paVar1[iVar59].ha].fast,
                                                      psVar44->fast_ac[paVar1[iVar59].ha],iVar59,
                                                      psVar44->dequant[paVar1[iVar59].tq]);
                                  uVar74 = extraout_EDX_05;
                                  if (iVar43 == 0) goto LAB_0010d811;
                                  (*psVar44->idct_block_kernel)
                                            (paVar1[iVar59].data +
                                             (long)(int)((iVar41 * uVar53 + iVar68) * 8) +
                                             (long)((iVar71 * iVar67 + iVar63) * paVar1[iVar59].w2 *
                                                   8),paVar1[iVar59].w2,(short *)&local_88a8);
                                  iVar68 = iVar68 + 1;
                                  iVar41 = paVar1[iVar59].h;
                                } while (iVar68 < iVar41);
                                iVar68 = paVar1[iVar59].v;
                              }
                              iVar63 = iVar63 + 1;
                            } while (iVar63 < iVar68);
                            iVar41 = psVar44->scan_n;
                          }
                          uVar64 = uVar64 + 1;
                        } while ((long)uVar64 < (long)iVar41);
                        iVar59 = psVar44->todo;
                      }
                      uVar74 = (uint)uVar64;
                      psVar44->todo = iVar59 + -1;
                      bVar78 = iVar59 < 2;
                      iVar59 = iVar59 + -1;
                      if (bVar78) {
                        if (psVar44->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar44);
                          uVar74 = extraout_EDX_06;
                        }
                        if ((psVar44->marker & 0xf8) != 0xd0) goto LAB_0010d80a;
                        psVar44->code_buffer = 0;
                        psVar44->code_bits = 0;
                        psVar44->nomore = 0;
                        psVar44->img_comp[3].dc_pred = 0;
                        psVar44->img_comp[2].dc_pred = 0;
                        psVar44->img_comp[1].dc_pred = 0;
                        psVar44->img_comp[0].dc_pred = 0;
                        psVar44->marker = 0xff;
                        iVar59 = psVar44->restart_interval;
                        if (iVar59 == 0) {
                          iVar59 = 0x7fffffff;
                        }
                        psVar44->todo = iVar59;
                        psVar44->eob_run = 0;
                      }
                      uVar53 = uVar53 + 1;
                      uVar64 = (ulong)uVar53;
                      iVar41 = psVar44->img_mcu_x;
                    } while ((int)uVar53 < iVar41);
                    uVar64 = (ulong)(uint)psVar44->img_mcu_y;
                  }
                  iVar67 = iVar67 + 1;
                  uVar74 = (uint)uVar64;
                } while (iVar67 < (int)uVar74);
                goto LAB_0010d80a;
              }
            }
            goto LAB_0010d813;
          }
          if (uVar74 == 1) {
            local_88f0 = (long)psVar44->order[0];
            local_88f4 = psVar44->img_comp[local_88f0].y + 7 >> 3;
            if (0 < local_88f4) {
              local_8900 = paVar1 + local_88f0;
              iVar41 = psVar44->img_comp[local_88f0].x + 7 >> 3;
              local_8974 = 0;
              do {
                if (0 < iVar41) {
                  iVar59 = 0;
                  do {
                    psVar76 = local_8900->coeff + (local_8900->coeff_w * local_8974 + iVar59) * 0x40
                    ;
                    uVar64 = (ulong)psVar44->spec_start;
                    if (uVar64 == 0) {
                      iVar67 = stbi__jpeg_decode_block_prog_dc
                                         (psVar44,psVar76,
                                          (stbi__huffman *)psVar44->huff_dc[local_8900->hd].fast,
                                          (int)local_88f0);
                      uVar74 = extraout_EDX_01;
                      if (iVar67 == 0) goto LAB_0010e0ef;
                    }
                    else {
                      iVar67 = local_8900->ha;
                      iVar68 = psVar44->eob_run;
                      bVar40 = (byte)psVar44->succ_low;
                      if (psVar44->succ_high == 0) {
                        if (iVar68 == 0) {
                          paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)psVar44->code_bits;
                          do {
                            if ((int)paVar57 < 0x10) {
                              stbi__grow_buffer_unsafe(psVar44);
                            }
                            uVar74 = psVar44->code_buffer;
                            uVar73 = (ulong)(uVar74 >> 0x17);
                            sVar69 = psVar44->fast_ac[iVar67][uVar73];
                            uVar53 = (uint)sVar69;
                            iVar68 = (int)uVar64;
                            if (sVar69 == 0) {
                              if (psVar44->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar44);
                                uVar74 = psVar44->code_buffer;
                                uVar73 = (ulong)(uVar74 >> 0x17);
                              }
                              uVar64 = (ulong)psVar44->huff_ac[iVar67].fast[uVar73];
                              if (uVar64 == 0xff) {
                                lVar58 = 0;
                                do {
                                  lVar55 = lVar58;
                                  lVar58 = lVar55 + 1;
                                } while (psVar44->huff_ac[iVar67].maxcode[lVar55 + 10] <=
                                         uVar74 >> 0x10);
                                uVar53 = psVar44->code_bits;
                                paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar53;
                                if (lVar58 == 8) goto LAB_0010f850;
                                if ((int)uVar53 < (int)(lVar55 + 10)) goto LAB_0010f859;
                                uVar66 = stbi__bmask[lVar55 + 10];
                                iVar63 = psVar44->huff_ac[iVar67].delta[lVar55 + 10];
                                sVar42 = uVar74 << ((byte)(lVar55 + 10) & 0x1f);
                                uVar53 = (uVar53 - (int)lVar58) - 9;
                                paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar53;
                                psVar44->code_bits = uVar53;
                                psVar44->code_buffer = sVar42;
                                uVar64 = (ulong)(int)((uVar74 >> (0x17U - (char)lVar58 & 0x1f) &
                                                      uVar66) + iVar63);
                              }
                              else {
                                bVar2 = psVar44->huff_ac[iVar67].size[uVar64];
                                uVar53 = psVar44->code_bits - (uint)bVar2;
                                paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar53;
                                if (psVar44->code_bits < (int)(uint)bVar2) goto LAB_0010f859;
                                sVar42 = uVar74 << (bVar2 & 0x1f);
                                psVar44->code_buffer = sVar42;
                                psVar44->code_bits = uVar53;
                              }
                              bVar2 = psVar44->huff_ac[iVar67].values[uVar64];
                              uVar74 = bVar2 & 0xf;
                              bVar31 = bVar2 >> 4;
                              uVar53 = (uint)bVar31;
                              iVar63 = (int)paVar57;
                              if ((bVar2 & 0xf) == 0) {
                                if (bVar2 < 0xf0) {
                                  iVar68 = 1 << bVar31;
                                  psVar44->eob_run = iVar68;
                                  if (0xf < bVar2) {
                                    if (iVar63 < (int)uVar53) {
                                      stbi__grow_buffer_unsafe(psVar44);
                                      sVar42 = psVar44->code_buffer;
                                      iVar63 = psVar44->code_bits;
                                      iVar68 = psVar44->eob_run;
                                    }
                                    uVar66 = sVar42 << bVar31 | sVar42 >> 0x20 - bVar31;
                                    uVar74 = stbi__bmask[uVar53];
                                    psVar44->code_buffer = ~uVar74 & uVar66;
                                    iVar68 = iVar68 + (uVar66 & uVar74);
                                    psVar44->code_bits = iVar63 - uVar53;
                                  }
                                  goto LAB_0010ccc7;
                                }
                                uVar74 = iVar68 + 0x10;
                              }
                              else {
                                lVar58 = (long)iVar68 + (ulong)uVar53;
                                bVar2 = ""[lVar58];
                                if (iVar63 < (int)uVar74) {
                                  stbi__grow_buffer_unsafe(psVar44);
                                  sVar42 = psVar44->code_buffer;
                                  iVar63 = psVar44->code_bits;
                                }
                                uVar66 = sVar42 << (sbyte)uVar74 | sVar42 >> 0x20 - (sbyte)uVar74;
                                uVar53 = *(uint *)((long)stbi__bmask + (ulong)(uVar74 * 4));
                                psVar44->code_buffer = ~uVar53 & uVar66;
                                paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar63 - uVar74);
                                psVar44->code_bits = iVar63 - uVar74;
                                iVar68 = 0;
                                if (-1 < (int)sVar42) {
                                  iVar68 = *(int *)((long)stbi__jbias + (ulong)(uVar74 * 4));
                                }
                                uVar74 = (int)lVar58 + 1;
                                psVar76[bVar2] =
                                     (short)((uVar53 & uVar66) + iVar68 << (bVar40 & 0x1f));
                              }
                            }
                            else {
                              lVar58 = (long)iVar68 + (ulong)(uVar53 >> 4 & 0xf);
                              psVar44->code_buffer = uVar74 << (sbyte)(uVar53 & 0xf);
                              uVar74 = psVar44->code_bits - (uVar53 & 0xf);
                              paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar74;
                              psVar44->code_bits = uVar74;
                              uVar74 = (int)lVar58 + 1;
                              psVar76[""[lVar58]] = (short)((uVar53 >> 8) << (bVar40 & 0x1f));
                            }
                            uVar64 = (ulong)uVar74;
                          } while ((int)uVar74 <= psVar44->spec_end);
                        }
                        else {
LAB_0010ccc7:
                          psVar44->eob_run = iVar68 + -1;
                        }
                      }
                      else if (iVar68 == 0) {
                        iVar68 = 0x10000 << (bVar40 & 0x1f);
                        paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)psVar44->code_bits;
                        do {
                          if ((int)paVar57 < 0x10) {
                            stbi__grow_buffer_unsafe(psVar44);
                          }
                          uVar74 = psVar44->code_buffer;
                          uVar73 = (ulong)psVar44->huff_ac[iVar67].fast[uVar74 >> 0x17];
                          if (uVar73 == 0xff) {
                            lVar58 = 0;
                            do {
                              lVar55 = lVar58;
                              lVar58 = lVar55 + 1;
                            } while (psVar44->huff_ac[iVar67].maxcode[lVar55 + 10] <= uVar74 >> 0x10
                                    );
                            uVar53 = psVar44->code_bits;
                            paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar53;
                            if (lVar58 == 8) goto LAB_0010f850;
                            if ((int)uVar53 < (int)(lVar55 + 10)) goto LAB_0010f859;
                            uVar66 = stbi__bmask[lVar55 + 10];
                            iVar63 = psVar44->huff_ac[iVar67].delta[lVar55 + 10];
                            sVar42 = uVar74 << ((byte)(lVar55 + 10) & 0x1f);
                            uVar53 = (uVar53 - (int)lVar58) - 9;
                            paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar53;
                            psVar44->code_bits = uVar53;
                            psVar44->code_buffer = sVar42;
                            uVar73 = (ulong)(int)((uVar74 >> (0x17U - (char)lVar58 & 0x1f) & uVar66)
                                                 + iVar63);
                          }
                          else {
                            bVar2 = psVar44->huff_ac[iVar67].size[uVar73];
                            uVar53 = psVar44->code_bits - (uint)bVar2;
                            paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar53;
                            if (psVar44->code_bits < (int)(uint)bVar2) goto LAB_0010f859;
                            sVar42 = uVar74 << (bVar2 & 0x1f);
                            psVar44->code_buffer = sVar42;
                            psVar44->code_bits = uVar53;
                          }
                          iVar63 = (int)paVar57;
                          bVar2 = psVar44->huff_ac[iVar67].values[uVar73];
                          bVar31 = bVar2 >> 4;
                          uVar74 = (uint)bVar31;
                          uVar73 = (ulong)uVar74;
                          if ((bVar2 & 0xf) == 1) {
                            if (iVar63 < 1) {
                              stbi__grow_buffer_unsafe(psVar44);
                              sVar42 = psVar44->code_buffer;
                              iVar63 = psVar44->code_bits;
                            }
                            sVar65 = sVar42 * 2;
                            psVar44->code_buffer = sVar65;
                            paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar63 - 1U);
                            sVar69 = (short)(((int)~sVar42 >> 0x1f | 1U) << (bVar40 & 0x1f));
                            psVar44->code_bits = iVar63 - 1U;
                          }
                          else {
                            if ((bVar2 & 0xf) != 0) goto LAB_0010f859;
                            if (bVar2 < 0xf0) {
                              uVar53 = ~(-1 << bVar31);
                              psVar44->eob_run = uVar53;
                              uVar60 = 0x40;
                              if (0xf < bVar2) {
                                if (iVar63 < (int)uVar74) {
                                  stbi__grow_buffer_unsafe(psVar44);
                                  sVar42 = psVar44->code_buffer;
                                  iVar63 = psVar44->code_bits;
                                  uVar53 = psVar44->eob_run;
                                }
                                uVar56 = sVar42 << bVar31 | sVar42 >> 0x20 - bVar31;
                                uVar66 = stbi__bmask[uVar73];
                                sVar65 = ~uVar66 & uVar56;
                                psVar44->code_buffer = sVar65;
                                paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar63 - uVar74);
                                psVar44->code_bits = iVar63 - uVar74;
                                psVar44->eob_run = (uVar56 & uVar66) + uVar53;
                                sVar69 = 0;
                                uVar73 = uVar60;
                                goto LAB_0010ce9c;
                              }
                            }
                            else {
                              uVar60 = 0xf;
                            }
                            sVar69 = 0;
                            uVar73 = uVar60;
                            sVar65 = sVar42;
                          }
LAB_0010ce9c:
                          uVar74 = psVar44->spec_end;
                          uVar60 = (ulong)uVar74;
                          if ((int)uVar64 <= (int)uVar74) {
                            uVar72 = (long)(int)uVar64;
                            do {
                              uVar74 = (uint)uVar60;
                              iVar63 = (int)paVar57;
                              bVar2 = ""[uVar72];
                              if (psVar76[bVar2] == 0) {
                                if ((int)uVar73 == 0) {
                                  uVar64 = (ulong)((int)uVar72 + 1);
                                  psVar76[bVar2] = sVar69;
                                  break;
                                }
                                uVar73 = (ulong)((int)uVar73 - 1);
                              }
                              else {
                                if (iVar63 < 1) {
                                  stbi__grow_buffer_unsafe(psVar44);
                                  sVar65 = psVar44->code_buffer;
                                  iVar63 = psVar44->code_bits;
                                }
                                sVar42 = sVar65 * 2;
                                psVar44->code_buffer = sVar42;
                                paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar63 - 1U);
                                psVar44->code_bits = iVar63 - 1U;
                                bVar78 = (int)sVar65 < 0;
                                sVar65 = sVar42;
                                if ((bVar78) &&
                                   (sVar4 = psVar76[bVar2], (iVar68 >> 0x10 & (int)sVar4) == 0)) {
                                  sVar32 = (short)((uint)iVar68 >> 0x10);
                                  if (sVar4 < 1) {
                                    sVar32 = -sVar32;
                                  }
                                  psVar76[bVar2] = sVar4 + sVar32;
                                }
                              }
                              uVar64 = uVar72 + 1;
                              uVar74 = psVar44->spec_end;
                              uVar60 = (ulong)(int)uVar74;
                              bVar78 = (long)uVar72 < (long)uVar60;
                              uVar72 = uVar64;
                            } while (bVar78);
                          }
                        } while ((int)uVar64 <= (int)uVar74);
                      }
                      else {
                        psVar44->eob_run = iVar68 + -1;
                        if (psVar44->spec_start <= psVar44->spec_end) {
                          uVar74 = (0x10000 << (bVar40 & 0x1f)) >> 0x10;
                          do {
                            bVar40 = ""[uVar64];
                            if (psVar76[bVar40] != 0) {
                              iVar67 = psVar44->code_bits;
                              if (iVar67 < 1) {
                                stbi__grow_buffer_unsafe(psVar44);
                                iVar67 = psVar44->code_bits;
                              }
                              sVar42 = psVar44->code_buffer;
                              psVar44->code_buffer = sVar42 * 2;
                              psVar44->code_bits = iVar67 + -1;
                              if (((int)sVar42 < 0) &&
                                 (sVar69 = psVar76[bVar40], (uVar74 & (int)sVar69) == 0)) {
                                uVar53 = -uVar74;
                                if (0 < sVar69) {
                                  uVar53 = uVar74;
                                }
                                psVar76[bVar40] = (short)uVar53 + sVar69;
                              }
                            }
                            bVar78 = (long)uVar64 < (long)psVar44->spec_end;
                            uVar64 = uVar64 + 1;
                          } while (bVar78);
                        }
                      }
                    }
                    iVar67 = psVar44->todo;
                    psVar44->todo = iVar67 + -1;
                    if (iVar67 < 2) {
                      if (psVar44->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar44);
                      }
                      bVar40 = psVar44->marker;
                      if ((bVar40 & 0xf8) != 0xd0) goto LAB_0010d826;
                      psVar44->code_buffer = 0;
                      psVar44->code_bits = 0;
                      psVar44->nomore = 0;
                      psVar44->img_comp[3].dc_pred = 0;
                      psVar44->img_comp[2].dc_pred = 0;
                      psVar44->img_comp[1].dc_pred = 0;
                      psVar44->img_comp[0].dc_pred = 0;
                      psVar44->marker = 0xff;
                      iVar67 = psVar44->restart_interval;
                      if (iVar67 == 0) {
                        iVar67 = 0x7fffffff;
                      }
                      psVar44->todo = iVar67;
                      psVar44->eob_run = 0;
                    }
                    iVar59 = iVar59 + 1;
                  } while (iVar59 != iVar41);
                }
                local_8974 = local_8974 + 1;
              } while (local_8974 != local_88f4);
            }
          }
          else {
            iVar41 = psVar44->img_mcu_y;
            if (0 < iVar41) {
              iVar67 = psVar44->img_mcu_x;
              iVar68 = 0;
              do {
                if (0 < iVar67) {
                  iVar41 = 0;
                  do {
                    iVar67 = psVar44->scan_n;
                    if (0 < iVar67) {
                      lVar58 = 0;
                      do {
                        iVar59 = psVar44->order[lVar58];
                        iVar63 = psVar44->img_comp[iVar59].v;
                        if (0 < iVar63) {
                          iVar67 = paVar1[iVar59].h;
                          iVar71 = 0;
                          do {
                            if (0 < iVar67) {
                              iVar63 = 0;
                              do {
                                iVar67 = stbi__jpeg_decode_block_prog_dc
                                                   (psVar44,paVar1[iVar59].coeff +
                                                            (iVar67 * iVar41 + iVar63 +
                                                            (paVar1[iVar59].v * iVar68 + iVar71) *
                                                            paVar1[iVar59].coeff_w) * 0x40,
                                                    (stbi__huffman *)
                                                    psVar44->huff_dc[paVar1[iVar59].hd].fast,iVar59)
                                ;
                                uVar74 = extraout_EDX_04;
                                if (iVar67 == 0) goto LAB_0010e0ef;
                                iVar63 = iVar63 + 1;
                                iVar67 = paVar1[iVar59].h;
                              } while (iVar63 < iVar67);
                              iVar63 = paVar1[iVar59].v;
                            }
                            iVar71 = iVar71 + 1;
                          } while (iVar71 < iVar63);
                          iVar67 = psVar44->scan_n;
                        }
                        lVar58 = lVar58 + 1;
                      } while (lVar58 < iVar67);
                      iVar59 = psVar44->todo;
                    }
                    psVar44->todo = iVar59 + -1;
                    bVar78 = iVar59 < 2;
                    iVar59 = iVar59 + -1;
                    if (bVar78) {
                      if (psVar44->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar44);
                      }
                      bVar40 = psVar44->marker;
                      if ((bVar40 & 0xf8) != 0xd0) goto LAB_0010d826;
                      psVar44->code_buffer = 0;
                      psVar44->code_bits = 0;
                      psVar44->nomore = 0;
                      psVar44->img_comp[3].dc_pred = 0;
                      psVar44->img_comp[2].dc_pred = 0;
                      psVar44->img_comp[1].dc_pred = 0;
                      psVar44->img_comp[0].dc_pred = 0;
                      psVar44->marker = 0xff;
                      iVar59 = psVar44->restart_interval;
                      if (iVar59 == 0) {
                        iVar59 = 0x7fffffff;
                      }
                      psVar44->todo = iVar59;
                      psVar44->eob_run = 0;
                    }
                    iVar41 = iVar41 + 1;
                    iVar67 = psVar44->img_mcu_x;
                  } while (iVar41 < iVar67);
                  iVar41 = psVar44->img_mcu_y;
                }
                iVar68 = iVar68 + 1;
              } while (iVar68 < iVar41);
            }
          }
          goto LAB_0010d81b;
        }
        uVar74 = (uint)bVar40;
        if (uVar74 == 0xdc) {
          iVar41 = stbi__get16be(psVar44->s);
          sVar42 = stbi__get16be(psVar44->s);
          paVar57 = extraout_RDX;
          if (iVar41 == 4) {
            if (sVar42 == psVar44->s->img_y) goto LAB_0010c653;
            stbi__g_failure_reason = "bad DNL height";
          }
          else {
            stbi__g_failure_reason = "bad DNL len";
          }
          goto LAB_0010e0e8;
        }
        if (uVar74 == 0xd9) {
          psVar47 = psVar44->s;
          uVar74 = psVar47->img_n;
          if (psVar44->progressive == 0) goto LAB_0010e127;
          if ((int)uVar74 < 1) {
            uVar53 = req_comp + (uint)(req_comp == 0);
            bVar78 = false;
          }
          else {
            lVar58 = 0;
            do {
              iVar41 = psVar44->img_comp[lVar58].y + 7 >> 3;
              if (0 < iVar41) {
                uVar74 = paVar1[lVar58].x + 7 >> 3;
                iVar59 = 0;
                do {
                  if (0 < (int)uVar74) {
                    uVar64 = 0;
                    do {
                      psVar76 = paVar1[lVar58].coeff +
                                (paVar1[lVar58].coeff_w * iVar59 + (int)uVar64) * 0x40;
                      iVar67 = paVar1[lVar58].tq;
                      lVar55 = 0;
                      do {
                        psVar76[lVar55] = psVar76[lVar55] * psVar44->dequant[iVar67][lVar55];
                        lVar55 = lVar55 + 1;
                      } while (lVar55 != 0x40);
                      (*psVar44->idct_block_kernel)
                                (paVar1[lVar58].data +
                                 uVar64 * 8 + (long)(iVar59 * 8 * paVar1[lVar58].w2),
                                 paVar1[lVar58].w2,psVar76);
                      uVar64 = uVar64 + 1;
                    } while (uVar64 != uVar74);
                  }
                  iVar59 = iVar59 + 1;
                } while (iVar59 != iVar41);
                psVar47 = psVar44->s;
              }
              lVar58 = lVar58 + 1;
              uVar74 = psVar47->img_n;
            } while (lVar58 < (int)uVar74);
LAB_0010e127:
            uVar53 = (2 < (int)uVar74) + 1 + (uint)(2 < (int)uVar74);
            if (req_comp != 0) {
              uVar53 = req_comp;
            }
            uVar66 = uVar74;
            if (uVar74 == 3) {
              bVar78 = true;
              uVar74 = 3;
              if (psVar44->rgb != 3) {
                uVar66 = 3;
                if (psVar44->app14_color_transform != 0) goto LAB_0010e161;
                bVar78 = psVar44->jfif == 0;
              }
            }
            else {
LAB_0010e161:
              uVar74 = uVar66;
              bVar78 = false;
            }
          }
          uVar66 = 1;
          if (bVar78) {
            uVar66 = uVar74;
          }
          if (uVar74 != 3) {
            uVar66 = uVar74;
          }
          if (2 < (int)uVar53) {
            uVar66 = uVar74;
          }
          sVar42 = psVar47->img_x;
          if ((int)uVar66 < 1) {
LAB_0010f11b:
            sVar65 = psVar47->img_y;
            psVar51 = (stbi__context *)stbi__malloc_mad3(uVar53,sVar42,sVar65,1);
            iVar41 = (int)extraout_RDX_03;
            if (psVar51 != (stbi__context *)0x0) {
              if (sVar65 != 0) {
                iVar59 = 0;
                uVar74 = 0;
                uVar64 = extraout_RDX_03;
                do {
                  sVar42 = psVar47->img_x;
                  if (0 < (int)uVar66) {
                    pasVar77 = (stbi_uc (*) [4])&local_88a8.ratio;
                    uVar73 = 0;
                    piVar70 = &psVar44->img_comp[0].y;
                    do {
                      asVar6 = pasVar77[-1];
                      asVar7 = pasVar77[-3];
                      iVar41 = (int)asVar7 >> 1;
                      auVar117 = (**(code **)(pasVar77 + -10))
                                           (*(stbi_uc **)(piVar70 + 10),
                                            *(undefined8 *)
                                             (*pasVar77 +
                                             ((ulong)(iVar41 <= (int)asVar6) << 3 |
                                             0xffffffffffffffe0)),
                                            *(undefined8 *)
                                             (*pasVar77 +
                                             ((ulong)((int)asVar6 < iVar41) << 3 |
                                             0xffffffffffffffe0)),pasVar77[-2],pasVar77[-4]);
                      uVar64 = auVar117._8_8_;
                      *(long *)(&local_8928.bpp + uVar73 * 2) = auVar117._0_8_;
                      pasVar77[-1] = (stbi_uc  [4])((int)asVar6 + 1);
                      if ((int)asVar7 <= (int)asVar6 + 1) {
                        pasVar77[-1] = (stbi_uc  [4])0x0;
                        *(stbi_uc **)(pasVar77 + -8) = *(stbi_uc **)(pasVar77 + -6);
                        asVar6 = *pasVar77;
                        *pasVar77 = (stbi_uc  [4])((int)asVar6 + 1);
                        if ((int)asVar6 + 1 < *piVar70) {
                          *(stbi_uc **)(pasVar77 + -6) = *(stbi_uc **)(pasVar77 + -6) + piVar70[1];
                        }
                      }
                      uVar73 = uVar73 + 1;
                      piVar70 = piVar70 + 0x18;
                      pasVar77 = pasVar77 + 0xc;
                    } while (uVar66 != uVar73);
                  }
                  if ((int)uVar53 < 3) {
                    psVar47 = psVar44->s;
                    if (bVar78) {
                      if (uVar53 == 1) {
                        if (psVar47->img_x != 0) {
                          uVar64 = CONCAT44(local_8928.mb,local_8928.mg);
                          uVar73 = 0;
                          do {
                            bVar40 = *(byte *)(uVar64 + uVar73);
                            psVar51->buffer_start[uVar73 + sVar42 * iVar59 + -0x38] =
                                 (stbi_uc)((uint)bVar40 * 2 + ((uint)bVar40 + (uint)bVar40 * 8) * 3
                                           + (uint)*(byte *)(CONCAT44(local_8928.mr,local_8928.hsz)
                                                            + uVar73) * 0x96 +
                                             (uint)*(byte *)(CONCAT44(local_8928.offset,
                                                                      local_8928.bpp) + uVar73) *
                                             0x4d >> 8);
                            uVar73 = uVar73 + 1;
                          } while (uVar73 < psVar47->img_x);
                        }
                      }
                      else if (psVar47->img_x != 0) {
                        uVar64 = CONCAT44(local_8928.mb,local_8928.mg);
                        uVar73 = 0;
                        do {
                          bVar40 = *(byte *)(uVar64 + uVar73);
                          psVar51->buffer_start[uVar73 * 2 + (ulong)(sVar42 * iVar59) + -0x38] =
                               (stbi_uc)((uint)bVar40 * 2 + ((uint)bVar40 + (uint)bVar40 * 8) * 3 +
                                         (uint)*(byte *)(CONCAT44(local_8928.mr,local_8928.hsz) +
                                                        uVar73) * 0x96 +
                                         (uint)*(byte *)(CONCAT44(local_8928.offset,local_8928.bpp)
                                                        + uVar73) * 0x4d >> 8);
                          psVar51->buffer_start[uVar73 * 2 + (ulong)(sVar42 * iVar59) + -0x37] =
                               0xff;
                          uVar73 = uVar73 + 1;
                        } while (uVar73 < psVar47->img_x);
                      }
                    }
                    else if (psVar47->img_n == 4) {
                      if (psVar44->app14_color_transform == 2) {
                        if (psVar47->img_x != 0) {
                          psVar62 = psVar51->buffer_start + ((ulong)(sVar42 * iVar59) - 0x37);
                          uVar64 = 0;
                          do {
                            iVar41 = (*(byte *)(CONCAT44(local_8928.offset,local_8928.bpp) + uVar64)
                                     ^ 0xff) * (uint)*(byte *)(CONCAT44(local_8928.all_a,
                                                                        local_8928.ma) + uVar64);
                            psVar62[-1] = (char)((iVar41 + 0x80U >> 8) + iVar41 + 0x80 >> 8);
                            *psVar62 = 0xff;
                            uVar64 = uVar64 + 1;
                            psVar62 = psVar62 + uVar53;
                          } while (uVar64 < psVar47->img_x);
                        }
                      }
                      else {
                        if (psVar44->app14_color_transform != 0) goto LAB_0010f56a;
                        if (psVar47->img_x != 0) {
                          uVar64 = CONCAT44(local_8928.mr,local_8928.hsz);
                          psVar62 = psVar51->buffer_start + ((ulong)(sVar42 * iVar59) - 0x37);
                          uVar73 = 0;
                          do {
                            bVar40 = *(byte *)(CONCAT44(local_8928.all_a,local_8928.ma) + uVar73);
                            iVar41 = (uint)*(byte *)(CONCAT44(local_8928.offset,local_8928.bpp) +
                                                    uVar73) * (uint)bVar40;
                            iVar67 = (uint)*(byte *)(uVar64 + uVar73) * (uint)bVar40;
                            iVar68 = (uint)*(byte *)(CONCAT44(local_8928.mb,local_8928.mg) + uVar73)
                                     * (uint)bVar40;
                            psVar62[-1] = (char)(((iVar68 + 0x80U >> 8) + iVar68 + 0x80 >> 8) * 0x1d
                                                 + (iVar67 + (iVar67 + 0x80U >> 8) + 0x80 >> 8) *
                                                   0x96 + (iVar41 + (iVar41 + 0x80U >> 8) + 0x80 >>
                                                          8) * 0x4d >> 8);
                            *psVar62 = 0xff;
                            uVar73 = uVar73 + 1;
                            psVar62 = psVar62 + uVar53;
                          } while (uVar73 < psVar47->img_x);
                        }
                      }
                    }
                    else {
LAB_0010f56a:
                      if (uVar53 == 1) {
                        if (psVar47->img_x != 0) {
                          uVar73 = 0;
                          do {
                            psVar51->buffer_start[uVar73 + sVar42 * iVar59 + -0x38] =
                                 *(stbi_uc *)(CONCAT44(local_8928.offset,local_8928.bpp) + uVar73);
                            uVar73 = uVar73 + 1;
                            uVar64 = (ulong)psVar47->img_x;
                          } while (uVar73 < uVar64);
                        }
                      }
                      else if (psVar47->img_x != 0) {
                        uVar73 = 0;
                        do {
                          psVar51->buffer_start[uVar73 * 2 + (ulong)(sVar42 * iVar59) + -0x38] =
                               *(stbi_uc *)(CONCAT44(local_8928.offset,local_8928.bpp) + uVar73);
                          psVar51->buffer_start[uVar73 * 2 + (ulong)(sVar42 * iVar59) + -0x37] =
                               0xff;
                          uVar73 = uVar73 + 1;
                          uVar64 = (ulong)psVar47->img_x;
                        } while (uVar73 < uVar64);
                      }
                    }
                  }
                  else {
                    psVar62 = (stbi_uc *)CONCAT44(local_8928.offset,local_8928.bpp);
                    psVar47 = psVar44->s;
                    if (psVar47->img_n == 3) {
                      if (bVar78) {
                        if (psVar47->img_x != 0) {
                          psVar61 = psVar51->buffer_start + ((ulong)(sVar42 * iVar59) - 0x35);
                          uVar64 = 0;
                          do {
                            psVar61[-3] = psVar62[uVar64];
                            psVar61[-2] = *(undefined1 *)
                                           (CONCAT44(local_8928.mr,local_8928.hsz) + uVar64);
                            psVar61[-1] = *(undefined1 *)
                                           (CONCAT44(local_8928.mb,local_8928.mg) + uVar64);
                            *psVar61 = 0xff;
                            uVar64 = uVar64 + 1;
                            psVar61 = psVar61 + uVar53;
                          } while (uVar64 < psVar47->img_x);
                        }
                      }
                      else {
LAB_0010f5dd:
                        (*psVar44->YCbCr_to_RGB_kernel)
                                  (psVar51->buffer_start +
                                   ((ulong)(uVar74 * uVar53 * sVar42) - 0x38),psVar62,
                                   (stbi_uc *)CONCAT44(local_8928.mr,local_8928.hsz),
                                   (stbi_uc *)CONCAT44(local_8928.mb,local_8928.mg),psVar47->img_x,
                                   uVar53);
                        psVar47 = psVar44->s;
                        uVar64 = extraout_RDX_04;
                      }
                    }
                    else if (psVar47->img_n == 4) {
                      if (psVar44->app14_color_transform == 2) {
                        (*psVar44->YCbCr_to_RGB_kernel)
                                  (psVar51->buffer_start +
                                   ((ulong)(uVar74 * uVar53 * sVar42) - 0x38),psVar62,
                                   (stbi_uc *)CONCAT44(local_8928.mr,local_8928.hsz),
                                   (stbi_uc *)CONCAT44(local_8928.mb,local_8928.mg),psVar47->img_x,
                                   uVar53);
                        psVar47 = psVar44->s;
                        uVar64 = extraout_RDX_05;
                        if (psVar47->img_x != 0) {
                          psVar62 = psVar51->buffer_start + ((ulong)(sVar42 * iVar59) - 0x36);
                          uVar73 = 0;
                          do {
                            bVar40 = *(byte *)(CONCAT44(local_8928.all_a,local_8928.ma) + uVar73);
                            iVar41 = (psVar62[-2] ^ 0xff) * (uint)bVar40;
                            psVar62[-2] = (byte)((iVar41 + 0x80U >> 8) + iVar41 + 0x80 >> 8);
                            iVar41 = (psVar62[-1] ^ 0xff) * (uint)bVar40;
                            psVar62[-1] = (byte)(iVar41 + (iVar41 + 0x80U >> 8) + 0x80 >> 8);
                            iVar41 = (*psVar62 ^ 0xff) * (uint)bVar40;
                            uVar56 = iVar41 + 0x80U >> 8;
                            uVar64 = (ulong)uVar56;
                            *psVar62 = (byte)(iVar41 + uVar56 + 0x80 >> 8);
                            uVar73 = uVar73 + 1;
                            psVar62 = psVar62 + uVar53;
                          } while (uVar73 < psVar47->img_x);
                        }
                      }
                      else {
                        if (psVar44->app14_color_transform != 0) goto LAB_0010f5dd;
                        if (psVar47->img_x != 0) {
                          uVar64 = CONCAT44(local_8928.mb,local_8928.mg);
                          psVar61 = psVar51->buffer_start + ((ulong)(sVar42 * iVar59) - 0x35);
                          uVar73 = 0;
                          do {
                            bVar40 = *(byte *)(CONCAT44(local_8928.all_a,local_8928.ma) + uVar73);
                            iVar41 = (uint)psVar62[uVar73] * (uint)bVar40;
                            psVar61[-3] = (char)((iVar41 + 0x80U >> 8) + iVar41 + 0x80 >> 8);
                            iVar41 = (uint)*(byte *)(CONCAT44(local_8928.mr,local_8928.hsz) + uVar73
                                                    ) * (uint)bVar40;
                            psVar61[-2] = (char)(iVar41 + (iVar41 + 0x80U >> 8) + 0x80 >> 8);
                            iVar41 = (uint)*(byte *)(uVar64 + uVar73) * (uint)bVar40;
                            psVar61[-1] = (char)(iVar41 + (iVar41 + 0x80U >> 8) + 0x80 >> 8);
                            *psVar61 = 0xff;
                            uVar73 = uVar73 + 1;
                            psVar61 = psVar61 + uVar53;
                          } while (uVar73 < psVar47->img_x);
                        }
                      }
                    }
                    else if (psVar47->img_x != 0) {
                      psVar61 = psVar51->buffer_start + ((ulong)(sVar42 * iVar59) - 0x35);
                      uVar73 = 0;
                      do {
                        sVar39 = psVar62[uVar73];
                        psVar61[-1] = sVar39;
                        psVar61[-2] = sVar39;
                        psVar61[-3] = sVar39;
                        *psVar61 = 0xff;
                        uVar73 = uVar73 + 1;
                        psVar61 = psVar61 + uVar53;
                      } while (uVar73 < psVar47->img_x);
                    }
                  }
                  iVar41 = (int)uVar64;
                  uVar74 = uVar74 + 1;
                  iVar59 = iVar59 + uVar53;
                } while (uVar74 < psVar47->img_y);
                uVar74 = psVar47->img_n;
              }
              stbi__free_jpeg_components(psVar44,uVar74,iVar41);
              psVar47 = psVar44->s;
              *x = psVar47->img_x;
              *y = psVar47->img_y;
              if (comp != (int *)0x0) {
                *comp = (uint)(2 < psVar47->img_n) * 2 + 1;
              }
              goto LAB_0010e109;
            }
            stbi__free_jpeg_components(psVar44,uVar74,iVar41);
            stbi__g_failure_reason = "outofmem";
            goto LAB_0010e103;
          }
          lVar58 = 0;
          while( true ) {
            pvVar49 = malloc((ulong)(sVar42 + 3));
            *(void **)((long)&psVar44->img_comp[0].linebuf + lVar58 * 2) = pvVar49;
            if (pvVar49 == (void *)0x0) break;
            uVar64 = (long)psVar44->img_h_max /
                     (long)*(int *)((long)&psVar44->img_comp[0].h + lVar58 * 2);
            iVar41 = (int)uVar64;
            *(int *)((long)(local_88a8.pal + -7) + lVar58) = iVar41;
            iVar59 = psVar44->img_v_max / *(int *)((long)&psVar44->img_comp[0].v + lVar58 * 2);
            *(int *)((long)(local_88a8.pal + -6) + lVar58) = iVar59;
            *(int *)((long)(local_88a8.pal + -4) + lVar58) = iVar59 >> 1;
            *(int *)((long)(local_88a8.pal + -5) + lVar58) =
                 (int)((ulong)((sVar42 - 1) + iVar41) / (uVar64 & 0xffffffff));
            *(undefined4 *)((long)(local_88a8.pal + -3) + lVar58) = 0;
            uVar8 = *(undefined8 *)((long)&psVar44->img_comp[0].data + lVar58 * 2);
            *(undefined8 *)((long)(local_88a8.pal + -9) + lVar58) = uVar8;
            *(undefined8 *)((long)(local_88a8.pal + -0xb) + lVar58) = uVar8;
            if (iVar41 == 2) {
              pcVar50 = stbi__resample_row_h_2;
              if (iVar59 != 1) {
                if (iVar59 != 2) goto LAB_0010f0ff;
                pcVar50 = psVar44->resample_row_hv_2_kernel;
              }
            }
            else if (iVar41 == 1) {
              pcVar50 = stbi__resample_row_generic;
              if (iVar59 == 2) {
                pcVar50 = stbi__resample_row_v_2;
              }
              if (iVar59 == 1) {
                pcVar50 = resample_row_1;
              }
            }
            else {
LAB_0010f0ff:
              pcVar50 = stbi__resample_row_generic;
            }
            *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar58) = pcVar50;
            lVar58 = lVar58 + 0x30;
            if ((ulong)uVar66 * 0x30 == lVar58) goto LAB_0010f11b;
          }
          stbi__free_jpeg_components(psVar44,uVar74,why);
          stbi__g_failure_reason = "outofmem";
          psVar51 = (stbi__context *)0x0;
          goto LAB_0010e109;
        }
        iVar41 = stbi__process_marker(psVar44,uVar74);
        uVar74 = extraout_EDX_00;
        if (iVar41 != 0) goto LAB_0010c653;
      }
LAB_0010e0ef:
      stbi__free_jpeg_components(psVar44,psVar44->s->img_n,uVar74);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_0010e103:
    psVar51 = (stbi__context *)0x0;
LAB_0010e109:
    free(psVar44);
  }
  else {
    iVar41 = stbi__check_png_header(s);
    psVar54 = s->img_buffer_original;
    psVar61 = s->img_buffer_original_end;
    s->img_buffer = psVar54;
    s->img_buffer_end = psVar61;
    if (iVar41 != 0) {
      if ((uint)req_comp < 5) {
        local_88a8._0_8_ = s;
        iVar41 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
        uVar8 = local_88a8._0_8_;
        if (iVar41 == 0) {
          psVar51 = (stbi__context *)0x0;
        }
        else {
          iVar41 = 8;
          if (8 < local_88a8.flags) {
            iVar41 = local_88a8.flags;
          }
          ri->bits_per_channel = iVar41;
          psVar51 = (stbi__context *)local_88a8.history;
          if ((req_comp != 0) && (iVar41 = *(int *)(local_88a8._0_8_ + 0xc), iVar41 != req_comp)) {
            if (local_88a8.flags < 9) {
              psVar51 = (stbi__context *)
                        stbi__convert_format
                                  (local_88a8.history,iVar41,req_comp,
                                   *(stbi__uint32 *)local_88a8._0_8_,
                                   *(stbi__uint32 *)(local_88a8._0_8_ + 4));
            }
            else {
              psVar51 = (stbi__context *)
                        stbi__convert_format16
                                  ((stbi__uint16 *)local_88a8.history,iVar41,req_comp,
                                   *(stbi__uint32 *)local_88a8._0_8_,
                                   *(stbi__uint32 *)(local_88a8._0_8_ + 4));
            }
            *(int *)(uVar8 + 0xc) = req_comp;
            if (psVar51 == (stbi__context *)0x0) goto LAB_0010c55e;
          }
          *x = *(stbi__uint32 *)uVar8;
          *y = *(stbi__uint32 *)(uVar8 + 4);
          if (comp != (int *)0x0) {
            *comp = *(int *)(uVar8 + 8);
          }
          local_88a8.history = (stbi_uc *)0x0;
        }
        free(local_88a8.history);
        free(local_88a8.background);
        psVar44 = (stbi__jpeg *)local_88a8.out;
        goto LAB_0010e109;
      }
      stbi__g_failure_reason = "bad req_comp";
      goto LAB_0010c55e;
    }
    if (psVar54 < psVar61) {
      psVar48 = psVar54 + 1;
      s->img_buffer = psVar48;
      sVar39 = *psVar54;
LAB_0010da4c:
      if (sVar39 != 'B') goto LAB_0010dc27;
      if (psVar48 < psVar61) {
        s->img_buffer = psVar48 + 1;
        sVar39 = *psVar48;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_0010dc27;
        psVar61 = s->buffer_start;
        iVar41 = (*(s->io).read)(s->io_user_data,(char *)psVar61,s->buflen);
        if (iVar41 == 0) {
          s->read_from_callbacks = 0;
          psVar54 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar39 = '\0';
        }
        else {
          psVar54 = psVar61 + iVar41;
          sVar39 = *psVar61;
        }
        s->img_buffer_end = psVar54;
        s->img_buffer = s->buffer_start + 1;
      }
      if (sVar39 != 'M') goto LAB_0010dc27;
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      uVar74 = stbi__get16le(s);
      iVar41 = stbi__get16le(s);
      uVar74 = iVar41 << 0x10 | uVar74;
      if (((0x38 < uVar74) || ((0x100010000001000U >> ((ulong)uVar74 & 0x3f) & 1) == 0)) &&
         (uVar74 != 0x6c)) {
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        if (uVar74 == 0x7c) goto LAB_0010db9d;
        goto LAB_0010dc39;
      }
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
LAB_0010db9d:
      local_8928.all_a = 0xff;
      pvVar49 = stbi__bmp_parse_header(s,&local_8928);
      uVar74 = local_8928.all_a;
      if (pvVar49 == (void *)0x0) goto LAB_0010c55e;
      sVar42 = s->img_y;
      sVar65 = -sVar42;
      if (0 < (int)sVar42) {
        sVar65 = sVar42;
      }
      s->img_y = sVar65;
      if (local_8928.hsz == 0xc) {
        if (local_8928.bpp < 0x18) {
          local_89a8 = (ulong)(uint)((local_8928.offset + -0x26) / 3);
        }
        else {
LAB_0010dd88:
          local_89a8 = 0;
        }
      }
      else {
        if (0xf < local_8928.bpp) goto LAB_0010dd88;
        local_89a8 = (ulong)(uint)((local_8928.offset - local_8928.hsz) + -0xe >> 2);
      }
      iVar41 = 4 - (uint)(local_8928.ma == 0);
      s->img_n = iVar41;
      if (2 < req_comp) {
        iVar41 = req_comp;
      }
      b = s->img_x;
      iVar59 = stbi__mad3sizes_valid(iVar41,b,sVar65,0);
      if (iVar59 == 0) {
        stbi__g_failure_reason = "too large";
      }
      else {
        data_00 = (uchar *)stbi__malloc_mad3(iVar41,b,sVar65,0);
        if (data_00 == (uchar *)0x0) {
          stbi__g_failure_reason = "outofmem";
        }
        else {
          if (local_8928.bpp < 0x10) {
            iVar59 = (int)local_89a8;
            if (0x100 < iVar59 || iVar59 == 0) {
              free(data_00);
              stbi__g_failure_reason = "invalid";
              goto LAB_0010c55e;
            }
            if (0 < iVar59) {
              psVar62 = s->buffer_start;
              psVar61 = s->buffer_start + 1;
              psVar54 = s->img_buffer;
              psVar48 = s->img_buffer_end;
              uVar64 = 0;
              do {
                if (psVar54 < psVar48) {
                  s->img_buffer = psVar54 + 1;
                  sVar39 = *psVar54;
                  psVar54 = psVar54 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar39 = '\0';
                }
                else {
                  iVar67 = (*(s->io).read)(s->io_user_data,(char *)psVar62,s->buflen);
                  if (iVar67 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar39 = '\0';
                    psVar48 = psVar61;
                  }
                  else {
                    sVar39 = *psVar62;
                    psVar48 = psVar62 + iVar67;
                  }
                  s->img_buffer_end = psVar48;
                  s->img_buffer = psVar61;
                  psVar54 = psVar61;
                }
                local_88a8.pal[uVar64 - 0xd][2] = sVar39;
                if (psVar54 < psVar48) {
                  s->img_buffer = psVar54 + 1;
                  sVar39 = *psVar54;
                  psVar54 = psVar54 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar39 = '\0';
                }
                else {
                  iVar67 = (*(s->io).read)(s->io_user_data,(char *)psVar62,s->buflen);
                  if (iVar67 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar39 = '\0';
                    psVar48 = psVar61;
                  }
                  else {
                    sVar39 = *psVar62;
                    psVar48 = psVar62 + iVar67;
                  }
                  s->img_buffer_end = psVar48;
                  s->img_buffer = psVar61;
                  psVar54 = psVar61;
                }
                local_88a8.pal[uVar64 - 0xd][1] = sVar39;
                if (psVar54 < psVar48) {
                  s->img_buffer = psVar54 + 1;
                  sVar39 = *psVar54;
                  psVar54 = psVar54 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  sVar39 = '\0';
                }
                else {
                  iVar67 = (*(s->io).read)(s->io_user_data,(char *)psVar62,s->buflen);
                  if (iVar67 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    sVar39 = '\0';
                    psVar48 = psVar61;
                  }
                  else {
                    sVar39 = *psVar62;
                    psVar48 = psVar62 + iVar67;
                  }
                  s->img_buffer_end = psVar48;
                  s->img_buffer = psVar61;
                  psVar54 = psVar61;
                }
                local_88a8.pal[uVar64 - 0xd][0] = sVar39;
                if (local_8928.hsz != 0xc) {
                  if (psVar54 < psVar48) {
                    psVar54 = psVar54 + 1;
                  }
                  else {
                    if (s->read_from_callbacks == 0) goto LAB_0010e328;
                    iVar67 = (*(s->io).read)(s->io_user_data,(char *)psVar62,s->buflen);
                    if (iVar67 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      psVar48 = psVar61;
                    }
                    else {
                      psVar48 = psVar62 + iVar67;
                    }
                    s->img_buffer_end = psVar48;
                    psVar54 = psVar61;
                  }
                  s->img_buffer = psVar54;
                }
LAB_0010e328:
                local_88a8.pal[uVar64 - 0xd][3] = 0xff;
                uVar64 = uVar64 + 1;
              } while (local_89a8 != uVar64);
            }
            stbi__skip(s,(iVar59 * (local_8928.hsz == 0xc | 0xfffffffc) - local_8928.hsz) +
                         local_8928.offset + -0xe);
            if (local_8928.bpp == 1) {
              sVar65 = s->img_y;
              if (0 < (int)sVar65) {
                local_89a8._0_4_ = -(s->img_x + 7 >> 3) & 3;
                psVar62 = s->buffer_start;
                psVar61 = s->buffer_start + 1;
                iVar67 = 0;
                iVar59 = 0;
                do {
                  psVar54 = s->img_buffer;
                  psVar48 = s->img_buffer_end;
                  if (psVar54 < psVar48) {
                    s->img_buffer = psVar54 + 1;
                    bVar40 = *psVar54;
                    psVar54 = psVar54 + 1;
                  }
                  else if (s->read_from_callbacks == 0) {
                    bVar40 = 0;
                  }
                  else {
                    iVar68 = (*(s->io).read)(s->io_user_data,(char *)psVar62,s->buflen);
                    if (iVar68 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      bVar40 = 0;
                      psVar48 = psVar61;
                    }
                    else {
                      bVar40 = *psVar62;
                      psVar48 = psVar62 + iVar68;
                    }
                    s->img_buffer_end = psVar48;
                    s->img_buffer = psVar61;
                    psVar54 = psVar61;
                  }
                  sVar65 = s->img_x;
                  if (0 < (int)sVar65) {
                    uVar53 = (uint)bVar40;
                    puVar52 = data_00 + (long)iVar67 + 2;
                    iVar68 = 0;
                    uVar66 = 7;
                    do {
                      uVar64 = (ulong)((uVar53 >> (uVar66 & 0x1f) & 1) != 0);
                      puVar52[-2] = local_88a8.pal[uVar64 - 0xd][0];
                      puVar52[-1] = local_88a8.pal[uVar64 - 0xd][1];
                      *puVar52 = local_88a8.pal[uVar64 - 0xd][2];
                      if ((int)uVar66 < 1) {
                        if (psVar54 < psVar48) {
                          s->img_buffer = psVar54 + 1;
                          uVar53 = (uint)*psVar54;
                          psVar54 = psVar54 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          uVar53 = 0;
                        }
                        else {
                          iVar63 = (*(s->io).read)(s->io_user_data,(char *)psVar62,s->buflen);
                          if (iVar63 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            uVar53 = 0;
                            psVar48 = psVar61;
                          }
                          else {
                            uVar53 = (uint)*psVar62;
                            psVar48 = psVar62 + iVar63;
                          }
                          s->img_buffer_end = psVar48;
                          s->img_buffer = psVar61;
                          sVar65 = s->img_x;
                          psVar54 = psVar61;
                        }
                        uVar66 = 7;
                      }
                      else {
                        uVar66 = uVar66 - 1;
                      }
                      iVar68 = iVar68 + 1;
                      iVar67 = iVar67 + 3;
                      puVar52 = puVar52 + 3;
                    } while (iVar68 < (int)sVar65);
                  }
                  stbi__skip(s,(uint)local_89a8);
                  iVar59 = iVar59 + 1;
                  sVar65 = s->img_y;
                } while (iVar59 < (int)sVar65);
              }
            }
            else {
              if (local_8928.bpp == 8) {
                uVar53 = s->img_x;
              }
              else {
                if (local_8928.bpp != 4) {
                  free(data_00);
                  stbi__g_failure_reason = "bad bpp";
                  goto LAB_0010c55e;
                }
                uVar53 = s->img_x + 1 >> 1;
              }
              sVar65 = s->img_y;
              if (0 < (int)sVar65) {
                local_8980 = -uVar53 & 3;
                psVar62 = s->buffer_start;
                psVar61 = s->buffer_start + 1;
                uVar64 = 0;
                iVar59 = 0;
                do {
                  if (0 < (int)s->img_x) {
                    psVar54 = s->img_buffer;
                    psVar48 = s->img_buffer_end;
                    iVar67 = 0;
                    do {
                      if (psVar54 < psVar48) {
                        s->img_buffer = psVar54 + 1;
                        bVar40 = *psVar54;
                        psVar54 = psVar54 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        bVar40 = 0;
                      }
                      else {
                        iVar68 = (*(s->io).read)(s->io_user_data,(char *)psVar62,s->buflen);
                        if (iVar68 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar40 = 0;
                          psVar48 = psVar61;
                        }
                        else {
                          bVar40 = *psVar62;
                          psVar48 = psVar62 + iVar68;
                        }
                        s->img_buffer_end = psVar48;
                        s->img_buffer = psVar61;
                        psVar54 = psVar61;
                      }
                      uVar66 = bVar40 & 0xf;
                      uVar53 = (uint)(bVar40 >> 4);
                      if (local_8928.bpp != 4) {
                        uVar53 = (uint)bVar40;
                      }
                      uVar73 = (ulong)uVar53;
                      if (local_8928.bpp != 4) {
                        uVar66 = 0;
                      }
                      lVar58 = (long)(int)uVar64;
                      uVar60 = lVar58 + 3;
                      data_00[lVar58] = local_88a8.pal[uVar73 - 0xd][0];
                      data_00[lVar58 + 1] = local_88a8.pal[uVar73 - 0xd][1];
                      data_00[lVar58 + 2] = local_88a8.pal[uVar73 - 0xd][2];
                      if (iVar41 == 4) {
                        data_00[lVar58 + 3] = 0xff;
                        uVar60 = (ulong)((int)uVar64 + 4);
                      }
                      if (iVar67 + 1U == s->img_x) {
                        uVar64 = uVar60 & 0xffffffff;
                        break;
                      }
                      if (local_8928.bpp == 8) {
                        if (psVar54 < psVar48) {
                          s->img_buffer = psVar54 + 1;
                          bVar40 = *psVar54;
                          psVar54 = psVar54 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          bVar40 = 0;
                        }
                        else {
                          iVar68 = (*(s->io).read)(s->io_user_data,(char *)psVar62,s->buflen);
                          if (iVar68 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar40 = 0;
                            psVar48 = psVar61;
                          }
                          else {
                            bVar40 = *psVar62;
                            psVar48 = psVar62 + iVar68;
                          }
                          s->img_buffer_end = psVar48;
                          s->img_buffer = psVar61;
                          psVar54 = psVar61;
                        }
                        uVar66 = (uint)bVar40;
                      }
                      lVar58 = (long)(int)uVar60;
                      uVar64 = lVar58 + 3;
                      uVar73 = (ulong)uVar66;
                      data_00[lVar58] = local_88a8.pal[uVar73 - 0xd][0];
                      data_00[lVar58 + 1] = local_88a8.pal[uVar73 - 0xd][1];
                      data_00[lVar58 + 2] = local_88a8.pal[uVar73 - 0xd][2];
                      if (iVar41 == 4) {
                        data_00[lVar58 + 3] = 0xff;
                        uVar64 = (ulong)((int)uVar60 + 4);
                      }
                      iVar67 = iVar67 + 2;
                    } while (iVar67 < (int)s->img_x);
                  }
                  stbi__skip(s,local_8980);
                  iVar59 = iVar59 + 1;
                  sVar65 = s->img_y;
                } while (iVar59 < (int)sVar65);
              }
            }
          }
          else {
            stbi__skip(s,(local_8928.offset - local_8928.hsz) + -0xe);
            if (local_8928.bpp == 0x10) {
              local_8930 = s->img_x * 2 & 2;
LAB_0010e484:
              if (local_8928.mb == 0 || (local_8928.mg == 0 || local_8928.mr == 0)) {
                free(data_00);
                stbi__g_failure_reason = "bad masks";
                goto LAB_0010c55e;
              }
              iVar59 = stbi__high_bit(local_8928.mr);
              iVar59 = iVar59 + -7;
              uVar53 = (local_8928.mr >> 1 & 0x55555555) + (local_8928.mr & 0x55555555);
              uVar53 = (uVar53 >> 2 & 0x33333333) + (uVar53 & 0x33333333);
              uVar53 = (uVar53 >> 4) + uVar53 & 0xf0f0f0f;
              uVar53 = (uVar53 >> 8) + uVar53;
              uVar66 = (uVar53 >> 0x10) + uVar53 & 0xff;
              local_8974 = stbi__high_bit(local_8928.mg);
              local_8974 = local_8974 + -7;
              uVar53 = (local_8928.mg >> 1 & 0x55555555) + (local_8928.mg & 0x55555555);
              uVar53 = (uVar53 >> 2 & 0x33333333) + (uVar53 & 0x33333333);
              uVar53 = (uVar53 >> 4) + uVar53 & 0xf0f0f0f;
              uVar53 = (uVar53 >> 8) + uVar53;
              uVar56 = (uVar53 >> 0x10) + uVar53 & 0xff;
              iVar67 = stbi__high_bit(local_8928.mb);
              local_8900 = (anon_struct_96_18_0d0905d3 *)CONCAT44(local_8900._4_4_,iVar67 + -7);
              uVar53 = (local_8928.mb >> 1 & 0x55555555) + (local_8928.mb & 0x55555555);
              uVar53 = (uVar53 >> 2 & 0x33333333) + (uVar53 & 0x33333333);
              uVar53 = (uVar53 >> 4) + uVar53 & 0xf0f0f0f;
              uVar53 = (uVar53 >> 8) + uVar53;
              uVar75 = (uVar53 >> 0x10) + uVar53 & 0xff;
              local_892c = stbi__high_bit(local_8928.ma);
              local_892c = local_892c + -7;
              uVar53 = (local_8928.ma >> 1 & 0x55555555) + (local_8928.ma & 0x55555555);
              uVar53 = (uVar53 >> 2 & 0x33333333) + (uVar53 & 0x33333333);
              uVar53 = (uVar53 >> 4) + uVar53 & 0xf0f0f0f;
              uVar53 = (uVar53 >> 8) + uVar53;
              uVar53 = (uVar53 >> 0x10) + uVar53 & 0xff;
              local_88f8 = 1;
              bVar78 = false;
            }
            else {
              if (local_8928.bpp == 0x20) {
                local_8930 = 0;
                if (local_8928.ma != 0xff000000 ||
                    (local_8928.mr != 0xff0000 || (local_8928.mg != 0xff00 || local_8928.mb != 0xff)
                    )) goto LAB_0010e484;
                bVar78 = true;
              }
              else {
                local_8930 = 0;
                if (local_8928.bpp != 0x18) goto LAB_0010e484;
                local_8930 = s->img_x & 3;
                bVar78 = false;
              }
              local_88f8 = 0;
              iVar59 = 0;
              local_8974 = 0;
              local_8900 = (anon_struct_96_18_0d0905d3 *)((ulong)local_8900 & 0xffffffff00000000);
              local_892c = 0;
              uVar66 = 0;
              uVar56 = 0;
              uVar75 = 0;
              uVar53 = 0;
            }
            sVar65 = s->img_y;
            if (0 < (int)sVar65) {
              psVar62 = s->buffer_start;
              psVar61 = s->buffer_start + 1;
              local_88f0 = CONCAT44(local_88f0._4_4_,-iVar59);
              local_88f4 = 8 - uVar66;
              local_88cc = -local_8974;
              local_88d0 = 8 - uVar56;
              local_88d4 = -(int)local_8900;
              local_88d8 = 8 - uVar75;
              local_88e0 = -local_892c;
              local_88dc = 8 - uVar53;
              iVar68 = 0;
              local_88b0 = (ulong)(uVar66 << 2);
              local_88b8 = (ulong)(uVar56 << 2);
              local_88c0 = (ulong)(uVar75 << 2);
              local_88c8 = (ulong)(uVar53 << 2);
              iVar67 = 0;
              do {
                local_88e4 = iVar67;
                if ((char)local_88f8 == '\0') {
                  if (0 < (int)s->img_x) {
                    psVar54 = s->img_buffer;
                    psVar48 = s->img_buffer_end;
                    iVar67 = 0;
                    do {
                      if (psVar54 < psVar48) {
                        s->img_buffer = psVar54 + 1;
                        bVar40 = *psVar54;
                        psVar54 = psVar54 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        bVar40 = 0;
                      }
                      else {
                        iVar63 = (*(s->io).read)(s->io_user_data,(char *)psVar62,s->buflen);
                        if (iVar63 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar40 = 0;
                          psVar48 = psVar61;
                        }
                        else {
                          bVar40 = *psVar62;
                          psVar48 = psVar62 + iVar63;
                        }
                        s->img_buffer_end = psVar48;
                        s->img_buffer = psVar61;
                        psVar54 = psVar61;
                      }
                      data_00[(long)iVar68 + 2] = bVar40;
                      if (psVar54 < psVar48) {
                        s->img_buffer = psVar54 + 1;
                        bVar40 = *psVar54;
                        psVar54 = psVar54 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        bVar40 = 0;
                      }
                      else {
                        iVar63 = (*(s->io).read)(s->io_user_data,(char *)psVar62,s->buflen);
                        if (iVar63 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar40 = 0;
                          psVar48 = psVar61;
                        }
                        else {
                          bVar40 = *psVar62;
                          psVar48 = psVar62 + iVar63;
                        }
                        s->img_buffer_end = psVar48;
                        s->img_buffer = psVar61;
                        psVar54 = psVar61;
                      }
                      data_00[(long)iVar68 + 1] = bVar40;
                      if (psVar54 < psVar48) {
                        s->img_buffer = psVar54 + 1;
                        bVar40 = *psVar54;
                        psVar54 = psVar54 + 1;
                      }
                      else if (s->read_from_callbacks == 0) {
                        bVar40 = 0;
                      }
                      else {
                        iVar63 = (*(s->io).read)(s->io_user_data,(char *)psVar62,s->buflen);
                        if (iVar63 == 0) {
                          s->read_from_callbacks = 0;
                          s->buffer_start[0] = '\0';
                          bVar40 = 0;
                          psVar48 = psVar61;
                        }
                        else {
                          bVar40 = *psVar62;
                          psVar48 = psVar62 + iVar63;
                        }
                        s->img_buffer_end = psVar48;
                        s->img_buffer = psVar61;
                        psVar54 = psVar61;
                      }
                      data_00[iVar68] = bVar40;
                      bVar40 = 0xff;
                      if (bVar78) {
                        if (psVar54 < psVar48) {
                          s->img_buffer = psVar54 + 1;
                          bVar40 = *psVar54;
                          psVar54 = psVar54 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          bVar40 = 0;
                        }
                        else {
                          iVar63 = (*(s->io).read)(s->io_user_data,(char *)psVar62,s->buflen);
                          if (iVar63 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar40 = 0;
                            psVar48 = psVar61;
                          }
                          else {
                            bVar40 = *psVar62;
                            psVar48 = psVar62 + iVar63;
                          }
                          s->img_buffer_end = psVar48;
                          s->img_buffer = psVar61;
                          psVar54 = psVar61;
                        }
                      }
                      iVar63 = iVar68 + 3;
                      if (iVar41 == 4) {
                        data_00[(long)iVar68 + 3] = bVar40;
                        iVar63 = iVar68 + 4;
                      }
                      iVar68 = iVar63;
                      uVar74 = uVar74 | bVar40;
                      iVar67 = iVar67 + 1;
                    } while (iVar67 < (int)s->img_x);
                  }
                }
                else if (0 < (int)s->img_x) {
                  iVar67 = 0;
                  do {
                    uVar53 = stbi__get16le(s);
                    if (local_8928.bpp != 0x10) {
                      iVar63 = stbi__get16le(s);
                      uVar53 = uVar53 | iVar63 << 0x10;
                    }
                    iVar63 = (int)(uVar53 & local_8928.mr) >> ((byte)iVar59 & 0x1f);
                    if (iVar59 < 0) {
                      iVar63 = (uVar53 & local_8928.mr) << ((byte)local_88f0 & 0x1f);
                    }
                    iVar71 = (int)(uVar53 & local_8928.mg) >> ((byte)local_8974 & 0x1f);
                    if (local_8974 < 0) {
                      iVar71 = (uVar53 & local_8928.mg) << ((byte)local_88cc & 0x1f);
                    }
                    iVar43 = *(int *)(stbi__shiftsigned(int,int,int)::mul_table + local_88b8);
                    bVar40 = stbi__shiftsigned(int,int,int)::shift_table[local_88b8];
                    iVar30 = (int)(uVar53 & local_8928.mb) >> ((byte)local_8900 & 0x1f);
                    if ((int)local_8900 < 0) {
                      iVar30 = (uVar53 & local_8928.mb) << ((byte)local_88d4 & 0x1f);
                    }
                    iVar5 = *(int *)(stbi__shiftsigned(int,int,int)::mul_table + local_88c0);
                    bVar2 = stbi__shiftsigned(int,int,int)::shift_table[local_88c0];
                    data_00[iVar68] =
                         (uchar)((iVar63 >> ((byte)local_88f4 & 0x1f)) *
                                 *(int *)(stbi__shiftsigned(int,int,int)::mul_table + local_88b0) >>
                                (stbi__shiftsigned(int,int,int)::shift_table[local_88b0] & 0x1f));
                    data_00[(long)iVar68 + 1] =
                         (uchar)((iVar71 >> ((byte)local_88d0 & 0x1f)) * iVar43 >> (bVar40 & 0x1f));
                    data_00[(long)iVar68 + 2] =
                         (uchar)((iVar30 >> ((byte)local_88d8 & 0x1f)) * iVar5 >> (bVar2 & 0x1f));
                    if (local_8928.ma == 0) {
                      uVar53 = 0xff;
                    }
                    else {
                      iVar63 = (int)(uVar53 & local_8928.ma) >> ((byte)local_892c & 0x1f);
                      if (local_892c < 0) {
                        iVar63 = (uVar53 & local_8928.ma) << ((byte)local_88e0 & 0x1f);
                      }
                      uVar53 = (iVar63 >> ((byte)local_88dc & 0x1f)) *
                               *(int *)(stbi__shiftsigned(int,int,int)::mul_table + local_88c8) >>
                               (stbi__shiftsigned(int,int,int)::shift_table[local_88c8] & 0x1f);
                    }
                    iVar63 = iVar68 + 3;
                    if (iVar41 == 4) {
                      data_00[(long)iVar68 + 3] = (uchar)uVar53;
                      iVar63 = iVar68 + 4;
                    }
                    iVar68 = iVar63;
                    uVar74 = uVar74 | uVar53;
                    iVar67 = iVar67 + 1;
                  } while (iVar67 < (int)s->img_x);
                }
                stbi__skip(s,local_8930);
                iVar67 = local_88e4 + 1;
                sVar65 = s->img_y;
              } while (iVar67 < (int)sVar65);
            }
          }
          auVar38 = _DAT_001260f0;
          auVar37 = _DAT_001260e0;
          auVar36 = _DAT_001260d0;
          auVar35 = _DAT_001260c0;
          auVar34 = _DAT_00126070;
          auVar33 = _DAT_00126060;
          auVar117 = _DAT_00126050;
          if (((iVar41 == 4) && (uVar74 == 0)) &&
             (uVar74 = s->img_x * sVar65 * 4 - 1, -1 < (int)uVar74)) {
            uVar53 = uVar74 >> 2;
            auVar79._4_4_ = 0;
            auVar79._0_4_ = uVar53;
            auVar79._8_4_ = uVar53;
            auVar79._12_4_ = 0;
            puVar52 = data_00 + uVar74;
            uVar64 = 0;
            do {
              auVar97._8_4_ = (int)uVar64;
              auVar97._0_8_ = uVar64;
              auVar97._12_4_ = (int)(uVar64 >> 0x20);
              auVar99 = auVar79 | auVar33;
              auVar101 = (auVar97 | auVar117) ^ auVar33;
              iVar59 = auVar99._0_4_;
              iVar71 = -(uint)(iVar59 < auVar101._0_4_);
              iVar67 = auVar99._4_4_;
              auVar103._4_4_ = -(uint)(iVar67 < auVar101._4_4_);
              iVar68 = auVar99._8_4_;
              iVar43 = -(uint)(iVar68 < auVar101._8_4_);
              iVar63 = auVar99._12_4_;
              auVar103._12_4_ = -(uint)(iVar63 < auVar101._12_4_);
              auVar80._4_4_ = iVar71;
              auVar80._0_4_ = iVar71;
              auVar80._8_4_ = iVar43;
              auVar80._12_4_ = iVar43;
              auVar80 = pshuflw(in_XMM1,auVar80,0xe8);
              auVar102._4_4_ = -(uint)(auVar101._4_4_ == iVar67);
              auVar102._12_4_ = -(uint)(auVar101._12_4_ == iVar63);
              auVar102._0_4_ = auVar102._4_4_;
              auVar102._8_4_ = auVar102._12_4_;
              auVar89 = pshuflw(in_XMM2,auVar102,0xe8);
              auVar103._0_4_ = auVar103._4_4_;
              auVar103._8_4_ = auVar103._12_4_;
              auVar101 = pshuflw(auVar80,auVar103,0xe8);
              auVar99._8_4_ = 0xffffffff;
              auVar99._0_8_ = 0xffffffffffffffff;
              auVar99._12_4_ = 0xffffffff;
              auVar99 = (auVar101 | auVar89 & auVar80) ^ auVar99;
              auVar99 = packssdw(auVar99,auVar99);
              if ((auVar99 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *puVar52 = 0xff;
              }
              auVar89._4_4_ = iVar71;
              auVar89._0_4_ = iVar71;
              auVar89._8_4_ = iVar43;
              auVar89._12_4_ = iVar43;
              auVar103 = auVar102 & auVar89 | auVar103;
              auVar99 = packssdw(auVar103,auVar103);
              auVar101._8_4_ = 0xffffffff;
              auVar101._0_8_ = 0xffffffffffffffff;
              auVar101._12_4_ = 0xffffffff;
              auVar99 = packssdw(auVar99 ^ auVar101,auVar99 ^ auVar101);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99._0_4_ >> 8 & 1) != 0) {
                puVar52[-4] = 0xff;
              }
              auVar99 = (auVar97 | auVar34) ^ auVar33;
              auVar90._0_4_ = -(uint)(iVar59 < auVar99._0_4_);
              auVar90._4_4_ = -(uint)(iVar67 < auVar99._4_4_);
              auVar90._8_4_ = -(uint)(iVar68 < auVar99._8_4_);
              auVar90._12_4_ = -(uint)(iVar63 < auVar99._12_4_);
              auVar104._4_4_ = auVar90._0_4_;
              auVar104._0_4_ = auVar90._0_4_;
              auVar104._8_4_ = auVar90._8_4_;
              auVar104._12_4_ = auVar90._8_4_;
              iVar71 = -(uint)(auVar99._4_4_ == iVar67);
              iVar43 = -(uint)(auVar99._12_4_ == iVar63);
              auVar18._4_4_ = iVar71;
              auVar18._0_4_ = iVar71;
              auVar18._8_4_ = iVar43;
              auVar18._12_4_ = iVar43;
              auVar114._4_4_ = auVar90._4_4_;
              auVar114._0_4_ = auVar90._4_4_;
              auVar114._8_4_ = auVar90._12_4_;
              auVar114._12_4_ = auVar90._12_4_;
              auVar99 = auVar18 & auVar104 | auVar114;
              auVar99 = packssdw(auVar99,auVar99);
              auVar9._8_4_ = 0xffffffff;
              auVar9._0_8_ = 0xffffffffffffffff;
              auVar9._12_4_ = 0xffffffff;
              auVar99 = packssdw(auVar99 ^ auVar9,auVar99 ^ auVar9);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99._0_4_ >> 0x10 & 1) != 0) {
                puVar52[-8] = 0xff;
              }
              auVar99 = pshufhw(auVar99,auVar104,0x84);
              auVar19._4_4_ = iVar71;
              auVar19._0_4_ = iVar71;
              auVar19._8_4_ = iVar43;
              auVar19._12_4_ = iVar43;
              auVar101 = pshufhw(auVar90,auVar19,0x84);
              auVar80 = pshufhw(auVar99,auVar114,0x84);
              auVar81._8_4_ = 0xffffffff;
              auVar81._0_8_ = 0xffffffffffffffff;
              auVar81._12_4_ = 0xffffffff;
              auVar81 = (auVar80 | auVar101 & auVar99) ^ auVar81;
              auVar99 = packssdw(auVar81,auVar81);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99._0_4_ >> 0x18 & 1) != 0) {
                puVar52[-0xc] = 0xff;
              }
              auVar99 = (auVar97 | auVar38) ^ auVar33;
              auVar91._0_4_ = -(uint)(iVar59 < auVar99._0_4_);
              auVar91._4_4_ = -(uint)(iVar67 < auVar99._4_4_);
              auVar91._8_4_ = -(uint)(iVar68 < auVar99._8_4_);
              auVar91._12_4_ = -(uint)(iVar63 < auVar99._12_4_);
              auVar20._4_4_ = auVar91._0_4_;
              auVar20._0_4_ = auVar91._0_4_;
              auVar20._8_4_ = auVar91._8_4_;
              auVar20._12_4_ = auVar91._8_4_;
              auVar101 = pshuflw(auVar114,auVar20,0xe8);
              auVar82._0_4_ = -(uint)(auVar99._0_4_ == iVar59);
              auVar82._4_4_ = -(uint)(auVar99._4_4_ == iVar67);
              auVar82._8_4_ = -(uint)(auVar99._8_4_ == iVar68);
              auVar82._12_4_ = -(uint)(auVar99._12_4_ == iVar63);
              auVar105._4_4_ = auVar82._4_4_;
              auVar105._0_4_ = auVar82._4_4_;
              auVar105._8_4_ = auVar82._12_4_;
              auVar105._12_4_ = auVar82._12_4_;
              auVar99 = pshuflw(auVar82,auVar105,0xe8);
              auVar106._4_4_ = auVar91._4_4_;
              auVar106._0_4_ = auVar91._4_4_;
              auVar106._8_4_ = auVar91._12_4_;
              auVar106._12_4_ = auVar91._12_4_;
              auVar80 = pshuflw(auVar91,auVar106,0xe8);
              auVar10._8_4_ = 0xffffffff;
              auVar10._0_8_ = 0xffffffffffffffff;
              auVar10._12_4_ = 0xffffffff;
              auVar99 = packssdw(auVar99 & auVar101,(auVar80 | auVar99 & auVar101) ^ auVar10);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar52[-0x10] = 0xff;
              }
              auVar21._4_4_ = auVar91._0_4_;
              auVar21._0_4_ = auVar91._0_4_;
              auVar21._8_4_ = auVar91._8_4_;
              auVar21._12_4_ = auVar91._8_4_;
              auVar106 = auVar105 & auVar21 | auVar106;
              auVar80 = packssdw(auVar106,auVar106);
              auVar11._8_4_ = 0xffffffff;
              auVar11._0_8_ = 0xffffffffffffffff;
              auVar11._12_4_ = 0xffffffff;
              auVar99 = packssdw(auVar99,auVar80 ^ auVar11);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99._4_2_ >> 8 & 1) != 0) {
                puVar52[-0x14] = 0xff;
              }
              auVar99 = (auVar97 | auVar37) ^ auVar33;
              auVar92._0_4_ = -(uint)(iVar59 < auVar99._0_4_);
              auVar92._4_4_ = -(uint)(iVar67 < auVar99._4_4_);
              auVar92._8_4_ = -(uint)(iVar68 < auVar99._8_4_);
              auVar92._12_4_ = -(uint)(iVar63 < auVar99._12_4_);
              auVar107._4_4_ = auVar92._0_4_;
              auVar107._0_4_ = auVar92._0_4_;
              auVar107._8_4_ = auVar92._8_4_;
              auVar107._12_4_ = auVar92._8_4_;
              iVar71 = -(uint)(auVar99._4_4_ == iVar67);
              iVar43 = -(uint)(auVar99._12_4_ == iVar63);
              auVar22._4_4_ = iVar71;
              auVar22._0_4_ = iVar71;
              auVar22._8_4_ = iVar43;
              auVar22._12_4_ = iVar43;
              auVar115._4_4_ = auVar92._4_4_;
              auVar115._0_4_ = auVar92._4_4_;
              auVar115._8_4_ = auVar92._12_4_;
              auVar115._12_4_ = auVar92._12_4_;
              auVar99 = auVar22 & auVar107 | auVar115;
              auVar99 = packssdw(auVar99,auVar99);
              auVar12._8_4_ = 0xffffffff;
              auVar12._0_8_ = 0xffffffffffffffff;
              auVar12._12_4_ = 0xffffffff;
              auVar99 = packssdw(auVar99 ^ auVar12,auVar99 ^ auVar12);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar52[-0x18] = 0xff;
              }
              auVar99 = pshufhw(auVar99,auVar107,0x84);
              auVar23._4_4_ = iVar71;
              auVar23._0_4_ = iVar71;
              auVar23._8_4_ = iVar43;
              auVar23._12_4_ = iVar43;
              auVar101 = pshufhw(auVar92,auVar23,0x84);
              auVar80 = pshufhw(auVar99,auVar115,0x84);
              auVar83._8_4_ = 0xffffffff;
              auVar83._0_8_ = 0xffffffffffffffff;
              auVar83._12_4_ = 0xffffffff;
              auVar83 = (auVar80 | auVar101 & auVar99) ^ auVar83;
              auVar99 = packssdw(auVar83,auVar83);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99._6_2_ >> 8 & 1) != 0) {
                puVar52[-0x1c] = 0xff;
              }
              auVar99 = (auVar97 | auVar36) ^ auVar33;
              auVar93._0_4_ = -(uint)(iVar59 < auVar99._0_4_);
              auVar93._4_4_ = -(uint)(iVar67 < auVar99._4_4_);
              auVar93._8_4_ = -(uint)(iVar68 < auVar99._8_4_);
              auVar93._12_4_ = -(uint)(iVar63 < auVar99._12_4_);
              auVar24._4_4_ = auVar93._0_4_;
              auVar24._0_4_ = auVar93._0_4_;
              auVar24._8_4_ = auVar93._8_4_;
              auVar24._12_4_ = auVar93._8_4_;
              auVar101 = pshuflw(auVar115,auVar24,0xe8);
              auVar84._0_4_ = -(uint)(auVar99._0_4_ == iVar59);
              auVar84._4_4_ = -(uint)(auVar99._4_4_ == iVar67);
              auVar84._8_4_ = -(uint)(auVar99._8_4_ == iVar68);
              auVar84._12_4_ = -(uint)(auVar99._12_4_ == iVar63);
              auVar108._4_4_ = auVar84._4_4_;
              auVar108._0_4_ = auVar84._4_4_;
              auVar108._8_4_ = auVar84._12_4_;
              auVar108._12_4_ = auVar84._12_4_;
              auVar99 = pshuflw(auVar84,auVar108,0xe8);
              auVar109._4_4_ = auVar93._4_4_;
              auVar109._0_4_ = auVar93._4_4_;
              auVar109._8_4_ = auVar93._12_4_;
              auVar109._12_4_ = auVar93._12_4_;
              auVar80 = pshuflw(auVar93,auVar109,0xe8);
              auVar94._8_4_ = 0xffffffff;
              auVar94._0_8_ = 0xffffffffffffffff;
              auVar94._12_4_ = 0xffffffff;
              auVar94 = (auVar80 | auVar99 & auVar101) ^ auVar94;
              auVar80 = packssdw(auVar94,auVar94);
              auVar99 = packsswb(auVar99 & auVar101,auVar80);
              if ((auVar99 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar52[-0x20] = 0xff;
              }
              auVar25._4_4_ = auVar93._0_4_;
              auVar25._0_4_ = auVar93._0_4_;
              auVar25._8_4_ = auVar93._8_4_;
              auVar25._12_4_ = auVar93._8_4_;
              auVar109 = auVar108 & auVar25 | auVar109;
              auVar80 = packssdw(auVar109,auVar109);
              auVar13._8_4_ = 0xffffffff;
              auVar13._0_8_ = 0xffffffffffffffff;
              auVar13._12_4_ = 0xffffffff;
              auVar80 = packssdw(auVar80 ^ auVar13,auVar80 ^ auVar13);
              auVar99 = packsswb(auVar99,auVar80);
              if ((auVar99._8_2_ >> 8 & 1) != 0) {
                puVar52[-0x24] = 0xff;
              }
              auVar99 = (auVar97 | auVar35) ^ auVar33;
              auVar95._0_4_ = -(uint)(iVar59 < auVar99._0_4_);
              auVar95._4_4_ = -(uint)(iVar67 < auVar99._4_4_);
              auVar95._8_4_ = -(uint)(iVar68 < auVar99._8_4_);
              auVar95._12_4_ = -(uint)(iVar63 < auVar99._12_4_);
              auVar110._4_4_ = auVar95._0_4_;
              auVar110._0_4_ = auVar95._0_4_;
              auVar110._8_4_ = auVar95._8_4_;
              auVar110._12_4_ = auVar95._8_4_;
              iVar71 = -(uint)(auVar99._4_4_ == iVar67);
              iVar43 = -(uint)(auVar99._12_4_ == iVar63);
              auVar26._4_4_ = iVar71;
              auVar26._0_4_ = iVar71;
              auVar26._8_4_ = iVar43;
              auVar26._12_4_ = iVar43;
              auVar116._4_4_ = auVar95._4_4_;
              auVar116._0_4_ = auVar95._4_4_;
              auVar116._8_4_ = auVar95._12_4_;
              auVar116._12_4_ = auVar95._12_4_;
              auVar99 = auVar26 & auVar110 | auVar116;
              auVar99 = packssdw(auVar99,auVar99);
              auVar14._8_4_ = 0xffffffff;
              auVar14._0_8_ = 0xffffffffffffffff;
              auVar14._12_4_ = 0xffffffff;
              auVar99 = packssdw(auVar99 ^ auVar14,auVar99 ^ auVar14);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                puVar52[-0x28] = 0xff;
              }
              auVar99 = pshufhw(auVar99,auVar110,0x84);
              auVar27._4_4_ = iVar71;
              auVar27._0_4_ = iVar71;
              auVar27._8_4_ = iVar43;
              auVar27._12_4_ = iVar43;
              auVar101 = pshufhw(auVar95,auVar27,0x84);
              auVar80 = pshufhw(auVar99,auVar116,0x84);
              auVar85._8_4_ = 0xffffffff;
              auVar85._0_8_ = 0xffffffffffffffff;
              auVar85._12_4_ = 0xffffffff;
              auVar85 = (auVar80 | auVar101 & auVar99) ^ auVar85;
              auVar99 = packssdw(auVar85,auVar85);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99._10_2_ >> 8 & 1) != 0) {
                puVar52[-0x2c] = 0xff;
              }
              auVar99 = (auVar97 | _DAT_001260b0) ^ auVar33;
              auVar96._0_4_ = -(uint)(iVar59 < auVar99._0_4_);
              auVar96._4_4_ = -(uint)(iVar67 < auVar99._4_4_);
              auVar96._8_4_ = -(uint)(iVar68 < auVar99._8_4_);
              auVar96._12_4_ = -(uint)(iVar63 < auVar99._12_4_);
              auVar28._4_4_ = auVar96._0_4_;
              auVar28._0_4_ = auVar96._0_4_;
              auVar28._8_4_ = auVar96._8_4_;
              auVar28._12_4_ = auVar96._8_4_;
              auVar101 = pshuflw(auVar116,auVar28,0xe8);
              auVar86._0_4_ = -(uint)(auVar99._0_4_ == iVar59);
              auVar86._4_4_ = -(uint)(auVar99._4_4_ == iVar67);
              auVar86._8_4_ = -(uint)(auVar99._8_4_ == iVar68);
              auVar86._12_4_ = -(uint)(auVar99._12_4_ == iVar63);
              auVar111._4_4_ = auVar86._4_4_;
              auVar111._0_4_ = auVar86._4_4_;
              auVar111._8_4_ = auVar86._12_4_;
              auVar111._12_4_ = auVar86._12_4_;
              auVar99 = pshuflw(auVar86,auVar111,0xe8);
              auVar112._4_4_ = auVar96._4_4_;
              auVar112._0_4_ = auVar96._4_4_;
              auVar112._8_4_ = auVar96._12_4_;
              auVar112._12_4_ = auVar96._12_4_;
              auVar80 = pshuflw(auVar96,auVar112,0xe8);
              auVar15._8_4_ = 0xffffffff;
              auVar15._0_8_ = 0xffffffffffffffff;
              auVar15._12_4_ = 0xffffffff;
              auVar99 = packssdw(auVar99 & auVar101,(auVar80 | auVar99 & auVar101) ^ auVar15);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar52[-0x30] = 0xff;
              }
              auVar29._4_4_ = auVar96._0_4_;
              auVar29._0_4_ = auVar96._0_4_;
              auVar29._8_4_ = auVar96._8_4_;
              auVar29._12_4_ = auVar96._8_4_;
              auVar112 = auVar111 & auVar29 | auVar112;
              auVar80 = packssdw(auVar112,auVar112);
              auVar16._8_4_ = 0xffffffff;
              auVar16._0_8_ = 0xffffffffffffffff;
              auVar16._12_4_ = 0xffffffff;
              auVar99 = packssdw(auVar99,auVar80 ^ auVar16);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99._12_2_ >> 8 & 1) != 0) {
                puVar52[-0x34] = 0xff;
              }
              auVar99 = (auVar97 | _DAT_001260a0) ^ auVar33;
              auVar87._0_4_ = -(uint)(iVar59 < auVar99._0_4_);
              auVar87._4_4_ = -(uint)(iVar67 < auVar99._4_4_);
              auVar87._8_4_ = -(uint)(iVar68 < auVar99._8_4_);
              auVar87._12_4_ = -(uint)(iVar63 < auVar99._12_4_);
              auVar113._4_4_ = auVar87._0_4_;
              auVar113._0_4_ = auVar87._0_4_;
              auVar113._8_4_ = auVar87._8_4_;
              auVar113._12_4_ = auVar87._8_4_;
              auVar98._4_4_ = -(uint)(auVar99._4_4_ == iVar67);
              auVar98._12_4_ = -(uint)(auVar99._12_4_ == iVar63);
              auVar98._0_4_ = auVar98._4_4_;
              auVar98._8_4_ = auVar98._12_4_;
              auVar100._4_4_ = auVar87._4_4_;
              auVar100._0_4_ = auVar87._4_4_;
              auVar100._8_4_ = auVar87._12_4_;
              auVar100._12_4_ = auVar87._12_4_;
              auVar80 = auVar98 & auVar113 | auVar100;
              auVar99 = packssdw(auVar87,auVar80);
              auVar17._8_4_ = 0xffffffff;
              auVar17._0_8_ = 0xffffffffffffffff;
              auVar17._12_4_ = 0xffffffff;
              auVar99 = packssdw(auVar99 ^ auVar17,auVar99 ^ auVar17);
              auVar99 = packsswb(auVar99,auVar99);
              if ((auVar99 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar52[-0x38] = 0xff;
              }
              auVar99 = pshufhw(auVar99,auVar113,0x84);
              in_XMM2 = pshufhw(auVar80,auVar98,0x84);
              in_XMM2 = in_XMM2 & auVar99;
              auVar99 = pshufhw(auVar99,auVar100,0x84);
              auVar88._8_4_ = 0xffffffff;
              auVar88._0_8_ = 0xffffffffffffffff;
              auVar88._12_4_ = 0xffffffff;
              auVar88 = (auVar99 | in_XMM2) ^ auVar88;
              auVar99 = packssdw(auVar88,auVar88);
              in_XMM1 = packsswb(auVar99,auVar99);
              if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                puVar52[-0x3c] = 0xff;
              }
              uVar64 = uVar64 + 0x10;
              puVar52 = puVar52 + -0x40;
            } while ((uVar53 + 0x10 & 0x3ffffff0) != uVar64);
          }
          if ((int)sVar42 < 1) {
            uVar74 = s->img_x;
          }
          else {
            uVar74 = s->img_x;
            if (0 < (int)sVar65 >> 1) {
              uVar53 = uVar74 * iVar41;
              uVar66 = (sVar65 - 1) * uVar53;
              uVar56 = 0;
              uVar64 = 0;
              do {
                if (0 < (int)uVar53) {
                  uVar73 = 0;
                  do {
                    uVar3 = data_00[uVar73 + uVar56];
                    data_00[uVar73 + uVar56] = data_00[uVar73 + uVar66];
                    data_00[uVar73 + uVar66] = uVar3;
                    uVar73 = uVar73 + 1;
                  } while (uVar53 != uVar73);
                }
                uVar64 = uVar64 + 1;
                uVar66 = uVar66 - uVar53;
                uVar56 = uVar56 + uVar53;
              } while (uVar64 != (uint)((int)sVar65 >> 1));
            }
          }
          if ((req_comp == 0) || (iVar41 == req_comp)) {
LAB_0010fe5c:
            *x = uVar74;
            *y = s->img_y;
            if (comp == (int *)0x0) {
              return data_00;
            }
            *comp = s->img_n;
            return data_00;
          }
          data_00 = stbi__convert_format(data_00,iVar41,req_comp,uVar74,sVar65);
          if (data_00 != (uchar *)0x0) {
            uVar74 = s->img_x;
            goto LAB_0010fe5c;
          }
        }
      }
    }
    else {
      if (s->read_from_callbacks != 0) {
        psVar54 = s->buffer_start;
        iVar41 = (*(s->io).read)(s->io_user_data,(char *)psVar54,s->buflen);
        if (iVar41 == 0) {
          s->read_from_callbacks = 0;
          psVar61 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar39 = '\0';
        }
        else {
          psVar61 = psVar54 + iVar41;
          sVar39 = *psVar54;
        }
        s->img_buffer_end = psVar61;
        psVar48 = s->buffer_start + 1;
        s->img_buffer = psVar48;
        goto LAB_0010da4c;
      }
LAB_0010dc27:
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
LAB_0010dc39:
      iVar41 = stbi__gif_test(s);
      if (iVar41 != 0) {
        memset(&local_88a8,0,0x8870);
        psVar47 = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,psVar62);
        psVar51 = (stbi__context *)0x0;
        if (psVar47 != (stbi__context *)0x0 && psVar47 != s) {
          *x = local_88a8.w;
          *y = local_88a8.h;
          psVar51 = psVar47;
          if ((req_comp & 0xfffffffbU) != 0) {
            psVar51 = (stbi__context *)
                      stbi__convert_format((uchar *)psVar47,4,req_comp,local_88a8.w,local_88a8.h);
          }
        }
        free(local_88a8.history);
        psVar44 = (stbi__jpeg *)local_88a8.background;
        goto LAB_0010e109;
      }
      iVar41 = stbi__psd_test(s);
      if (iVar41 != 0) {
        pvVar49 = stbi__psd_load(s,x,y,comp,req_comp,ri,bpc);
        return pvVar49;
      }
      iVar41 = stbi__pic_test(s);
      if (iVar41 != 0) {
        pvVar49 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
        return pvVar49;
      }
      iVar41 = stbi__pnm_test(s);
      if (iVar41 != 0) {
        pvVar49 = stbi__pnm_load(s,x,y,comp,req_comp,ri_00);
        return pvVar49;
      }
      iVar41 = stbi__hdr_test(s);
      if (iVar41 != 0) {
        data_01 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *comp;
        }
        psVar62 = stbi__hdr_to_ldr(data_01,*x,*y,req_comp);
        return psVar62;
      }
      iVar41 = stbi__tga_test(s);
      if (iVar41 != 0) {
        pvVar49 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
        return pvVar49;
      }
      stbi__g_failure_reason = "unknown image type";
    }
LAB_0010c55e:
    psVar51 = (stbi__context *)0x0;
  }
  return psVar51;
LAB_0010d811:
  bVar78 = false;
LAB_0010d813:
  if (!bVar78) goto LAB_0010e0ef;
LAB_0010d81b:
  bVar40 = psVar44->marker;
LAB_0010d826:
  if (bVar40 == 0xff) {
LAB_0010d833:
    do {
      psVar51 = psVar44->s;
      if ((psVar51->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0010d852:
        if (psVar51->img_buffer_end <= psVar51->img_buffer) goto LAB_0010c653;
      }
      else {
        iVar41 = (*(psVar51->io).eof)(psVar51->io_user_data);
        if (iVar41 != 0) {
          if (psVar51->read_from_callbacks != 0) goto LAB_0010d852;
          goto LAB_0010c653;
        }
      }
      psVar51 = psVar44->s;
      psVar62 = psVar51->img_buffer;
      if (psVar62 < psVar51->img_buffer_end) {
        psVar51->img_buffer = psVar62 + 1;
        sVar39 = *psVar62;
      }
      else {
        if (psVar51->read_from_callbacks == 0) goto LAB_0010d833;
        psVar62 = psVar51->buffer_start;
        iVar41 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar62,psVar51->buflen);
        if (iVar41 == 0) {
          psVar51->read_from_callbacks = 0;
          psVar61 = psVar51->buffer_start + 1;
          psVar51->buffer_start[0] = '\0';
          sVar39 = '\0';
        }
        else {
          psVar61 = psVar62 + iVar41;
          sVar39 = *psVar62;
        }
        psVar51->img_buffer_end = psVar61;
        psVar51->img_buffer = psVar51->buffer_start + 1;
      }
    } while (sVar39 != 0xff);
    psVar51 = psVar44->s;
    psVar62 = psVar51->img_buffer;
    if (psVar62 < psVar51->img_buffer_end) {
      psVar51->img_buffer = psVar62 + 1;
      sVar39 = *psVar62;
    }
    else if (psVar51->read_from_callbacks == 0) {
      sVar39 = '\0';
    }
    else {
      psVar62 = psVar51->buffer_start;
      iVar41 = (*(psVar51->io).read)(psVar51->io_user_data,(char *)psVar62,psVar51->buflen);
      if (iVar41 == 0) {
        psVar51->read_from_callbacks = 0;
        psVar61 = psVar51->buffer_start + 1;
        psVar51->buffer_start[0] = '\0';
        sVar39 = '\0';
      }
      else {
        psVar61 = psVar62 + iVar41;
        sVar39 = *psVar62;
      }
      psVar51->img_buffer_end = psVar61;
      psVar51->img_buffer = psVar51->buffer_start + 1;
    }
    psVar44->marker = sVar39;
  }
LAB_0010c653:
  bVar40 = stbi__get_marker(psVar44);
  goto LAB_0010c5fd;
LAB_0010f850:
  paVar57 = (anon_struct_96_18_0d0905d3 *)(ulong)(uVar53 - 0x10);
  psVar44->code_bits = uVar53 - 0x10;
LAB_0010f859:
  stbi__g_failure_reason = "bad huffman code";
LAB_0010e0e8:
  uVar74 = (uint)paVar57;
  goto LAB_0010e0ef;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}